

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O0

void __thiscall slang::ast::ConfigBlockSymbol::resolve(ConfigBlockSymbol *this)

{
  string_view arg;
  string_view arg_00;
  SourceRange sourceRange;
  string_view libName_00;
  string_view cellName_00;
  SourceRange sourceRange_00;
  InstanceOverride *pIVar1;
  type *ptVar2;
  string_view *psVar3;
  SyntaxNode **ppSVar4;
  bool bVar5;
  int iVar6;
  SyntaxNode *this_00;
  reference ppCVar7;
  StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>
  *pSVar8;
  reference ppCVar9;
  Scope **ppSVar10;
  allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_> *paVar11;
  char **ppcVar12;
  pointer ppVar13;
  ConfigRule *pCVar14;
  pointer ppVar15;
  reference pTVar16;
  pointer ppVar17;
  equal_to<const_slang::SourceLibrary_*> *peVar18;
  raw_key_type *ppSVar19;
  pointer_conflict ppVar20;
  undefined4 extraout_var;
  equal_to<const_slang::syntax::SyntaxNode_*> *this_01;
  raw_key_type *ppSVar21;
  pointer ppVar22;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_03;
  Symbol *in_RDI;
  SourceRange SVar23;
  span<const_slang::SourceLibrary_*,_18446744073709551615UL> sVar24;
  SourceRange SVar25;
  string_view sVar26;
  SourceRange SVar27;
  type *instOverride_1;
  type *__1;
  const_iterator __end2_5;
  const_iterator __begin2_5;
  flat_hash_map<std::string_view,_InstanceOverride> *__range2_5;
  type *rule_2;
  type *lib;
  iterator __end3;
  iterator __begin3;
  flat_hash_map<const_SourceLibrary_*,_ConfigRule_*> *__range3;
  type *cellOverride;
  type *_;
  iterator __end2_4;
  iterator __begin2_4;
  flat_hash_map<std::string_view,_CellOverride> *__range2_4;
  iterator specificIt;
  flat_hash_map<const_SourceLibrary_*,_ConfigRule_*> *specificLibRules;
  iterator it_3;
  TopCell *topCell;
  iterator __end2_3;
  iterator __begin2_3;
  SmallVector<slang::ast::ConfigBlockSymbol::TopCell,_2UL> *__range2_3;
  iterator it_2;
  type *instOverride;
  type *cellName_2;
  iterator __end2_2;
  iterator __begin2_2;
  flat_hash_map<std::string_view,_InstanceOverride> *__range2_2;
  anon_class_8_1_a89d2d74 checkTopOverride;
  ConfigRule rule_1;
  string_view partName;
  ConfigInstanceIdentifierSyntax **part;
  iterator __end4;
  iterator __begin4;
  SyntaxList<slang::syntax::ConfigInstanceIdentifierSyntax> *__range4;
  mapped_type *node;
  bool bad;
  string_view topName;
  InstanceConfigRuleSyntax *icr;
  type_conflict3 *inserted_1;
  type *it_1;
  SourceLibrary *specificLib;
  string_view libName;
  mapped_type *overrides;
  ConfigRule *rule;
  string_view cellName_1;
  CellConfigRuleSyntax *ccr;
  ConfigRuleSyntax *ruleSyntax;
  iterator __end2_1;
  iterator __begin2_1;
  SyntaxList<slang::syntax::ConfigRuleSyntax> *__range2_1;
  anon_class_8_1_a89d2d74 mergeRules;
  anon_class_8_1_df254053 buildRule;
  anon_class_16_2_f7902cf0 buildLiblist;
  type_conflict3 *inserted;
  type *it;
  DefinitionSymbol *def;
  string_view cellName;
  ConfigCellIdentifierSyntax *cellId;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::ConfigCellIdentifierSyntax> *__range2;
  SmallVector<slang::ast::ConfigBlockSymbol::TopCell,_2UL> topCellsBuf;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_2UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
  topCellNames;
  ConfigDeclarationSyntax *syntax;
  Compilation *comp;
  Scope *scope;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
  x;
  locator loc;
  size_t pos0;
  size_t hash;
  basic_string_view<char,_std::char_traits<char>_> *k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  locator loc_1;
  size_t pos0_1;
  size_t hash_1;
  basic_string_view<char,_std::char_traits<char>_> *k_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>,_const_slang::SourceLibrary_*&,_void>
  x_1;
  locator_conflict loc_2;
  size_t pos0_2;
  size_t hash_2;
  SourceLibrary **k_2;
  uint n_2;
  value_type_conflict *p_2;
  value_type_conflict *elements_2;
  int mask_2;
  group_type *pg_2;
  size_t pos_2;
  prober pb_2;
  size_t hash_6;
  uint n_6;
  value_type *p_6;
  value_type *elements_6;
  int mask_6;
  group_type *pg_6;
  size_t pos_6;
  prober pb_6;
  size_t hash_3;
  uint n_3;
  value_type *p_3;
  value_type *elements_3;
  int mask_3;
  group_type *pg_3;
  size_t pos_3;
  prober pb_3;
  locator loc_4;
  size_t pos0_4;
  size_t hash_5;
  basic_string_view<char,_std::char_traits<char>_> *k_4;
  locator loc_3;
  size_t pos0_3;
  size_t hash_4;
  basic_string_view<char,_std::char_traits<char>_> *k_3;
  uint n_4;
  value_type *p_4;
  value_type *elements_4;
  int mask_4;
  group_type *pg_4;
  size_t pos_4;
  prober pb_4;
  uint n_5;
  value_type *p_5;
  value_type *elements_5;
  int mask_5;
  group_type *pg_5;
  size_t pos_5;
  prober pb_5;
  size_t hash_7;
  uint n_7;
  value_type *p_7;
  value_type *elements_7;
  int mask_7;
  group_type *pg_7;
  size_t pos_7;
  prober pb_7;
  size_t hash_8;
  uint n_8;
  value_type_conflict *p_8;
  value_type_conflict *elements_8;
  int mask_8;
  group_type *pg_8;
  size_t pos_8;
  prober pb_8;
  locator loc_6;
  size_t pos0_6;
  size_t hash_10;
  SyntaxNode **k_6;
  uint n_10;
  value_type *p_10;
  value_type *elements_10;
  int mask_10;
  group_type *pg_10;
  size_t pos_10;
  prober pb_10;
  locator loc_5;
  size_t pos0_5;
  size_t hash_9;
  SyntaxNode **k_5;
  uint n_9;
  value_type *p_9;
  value_type *elements_9;
  int mask_9;
  group_type *pg_9;
  size_t pos_9;
  prober pb_9;
  SourceLocation in_stack_ffffffffffffe658;
  SourceLocation SVar28;
  SourceLocation in_stack_ffffffffffffe660;
  SourceLocation SVar29;
  span<slang::ast::ConfigBlockSymbol::TopCell,_18446744073709551615UL> *in_stack_ffffffffffffe668;
  undefined7 in_stack_ffffffffffffe670;
  undefined1 in_stack_ffffffffffffe677;
  ConfigRule *in_stack_ffffffffffffe678;
  Token *in_stack_ffffffffffffe680;
  undefined7 in_stack_ffffffffffffe688;
  undefined1 in_stack_ffffffffffffe68f;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
  *in_stack_ffffffffffffe690;
  Diagnostic *in_stack_ffffffffffffe6a0;
  undefined4 in_stack_ffffffffffffe6a8;
  undefined4 in_stack_ffffffffffffe6ac;
  SyntaxNode *in_stack_ffffffffffffe6b0;
  Symbol *pSVar30;
  char *in_stack_ffffffffffffe6b8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffe6c8;
  type in_stack_ffffffffffffe6d0;
  Symbol *in_stack_ffffffffffffe6d8;
  Symbol *pSVar31;
  ConfigBlockSymbol *in_stack_ffffffffffffe6e0;
  undefined7 in_stack_ffffffffffffe6e8;
  undefined1 in_stack_ffffffffffffe6ef;
  ConfigRule *in_stack_ffffffffffffe6f0;
  undefined7 in_stack_ffffffffffffe6f8;
  undefined1 in_stack_ffffffffffffe6ff;
  anon_class_8_1_a89d2d74 *in_stack_ffffffffffffe700;
  ConfigLiblistSyntax *in_stack_ffffffffffffe778;
  anon_class_16_2_f7902cf0 *in_stack_ffffffffffffe780;
  undefined7 in_stack_ffffffffffffe798;
  undefined1 in_stack_ffffffffffffe79f;
  SourceLocation in_stack_ffffffffffffe7a0;
  SourceLocation in_stack_ffffffffffffe7a8;
  SourceLibrary **ppSVar32;
  undefined8 in_stack_ffffffffffffe7b0;
  undefined4 in_stack_ffffffffffffe7b8;
  undefined4 in_stack_ffffffffffffe7bc;
  Compilation *in_stack_ffffffffffffe7c0;
  CellOverride *pCVar33;
  size_t in_stack_ffffffffffffe7c8;
  char *in_stack_ffffffffffffe7d0;
  size_t in_stack_ffffffffffffe7d8;
  char *in_stack_ffffffffffffe7e0;
  undefined7 in_stack_ffffffffffffe970;
  undefined1 in_stack_ffffffffffffe977;
  SourceLocation in_stack_ffffffffffffe978;
  ConfigBlockSymbol *local_1318;
  type *local_1310;
  type *local_1308;
  reference_conflict local_1300;
  iterator local_12f8;
  iterator local_12e8;
  type *local_12d8;
  SyntaxNode *local_12d0;
  type *local_12c8;
  type *local_12c0;
  reference local_12b8;
  iterator local_12b0;
  iterator local_12a0;
  Scope **local_1290;
  undefined8 local_1288;
  undefined8 local_1278;
  size_t local_1270;
  iterator local_1268;
  SourceLibrary *local_1258;
  char_pointer local_1250;
  table_element_pointer local_1248;
  CellOverride *local_1240;
  iterator local_1238;
  char_pointer local_1228;
  table_element_pointer local_1220;
  iterator local_1218;
  iterator local_1210;
  iterator local_1208;
  SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell> *local_1200;
  char_pointer local_11f8;
  table_element_pointer local_11f0;
  type *local_11e8;
  type *local_11e0;
  reference local_11d8;
  iterator local_11d0;
  iterator local_11c0;
  char **local_11b0;
  Scope **local_11a8;
  string_view *local_11a0;
  InstanceConfigRuleSyntax *local_1198;
  string_view local_1128;
  reference local_1118;
  ConfigInstanceIdentifierSyntax **local_1110;
  __normal_iterator<slang::syntax::ConfigInstanceIdentifierSyntax_**,_std::span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>_>
  local_1108;
  SyntaxList<slang::syntax::ConfigInstanceIdentifierSyntax> *local_1100;
  InstanceOverride *local_10f8;
  byte local_10e9;
  SourceRange local_10e8;
  undefined4 local_10d4;
  string_view local_10d0;
  InstanceConfigRuleSyntax *local_10c0;
  string_view *local_10b8;
  SourceLibrary **local_10b0;
  string_view *local_10a8;
  type_conflict3 *local_10a0;
  type *local_1098;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_1090;
  string_view local_1078;
  SourceRange local_1060;
  undefined4 local_104c;
  string_view local_1048;
  SourceLibrary *local_1030;
  string_view local_1028;
  CellOverride *local_1018;
  ConfigRule *local_fa8;
  string_view local_fa0;
  CellConfigRuleSyntax *local_f90;
  span<const_slang::SourceLibrary_*,_18446744073709551615UL> local_f88;
  char *local_f78;
  SourceLocation local_f70;
  SyntaxNode *local_f68;
  ConfigRuleSyntax **local_f60;
  __normal_iterator<slang::syntax::ConfigRuleSyntax_**,_std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>_>
  local_f58;
  SyntaxList<slang::syntax::ConfigRuleSyntax> *local_f50;
  Scope **local_f48;
  Compilation **local_f40;
  Compilation *local_f38;
  Scope **local_f30;
  string_view local_f28;
  SourceRange local_f10;
  undefined4 local_efc;
  SourceRange local_ef8;
  type_conflict3 *local_ee8;
  type *local_ee0;
  size_type local_ed8;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_ed0;
  SourceRange local_eb8;
  string_view local_ea8;
  string_view local_e98;
  DefinitionSymbol *local_e88;
  string_view local_e70;
  ConfigCellIdentifierSyntax *local_e60;
  ConfigCellIdentifierSyntax **local_e58;
  __normal_iterator<slang::syntax::ConfigCellIdentifierSyntax_**,_std::span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>_>
  local_e50;
  SyntaxList<slang::syntax::ConfigCellIdentifierSyntax> *local_e48;
  SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell> local_e40 [2];
  undefined1 local_db0 [16];
  size_t local_da0;
  ulong local_d88;
  ulong local_d80;
  ConfigDeclarationSyntax *local_d70;
  Compilation *local_d68;
  Scope *local_d60 [2];
  SourceLocation local_d50;
  string_view *local_d48;
  undefined1 *local_d40;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_d38;
  string_view *local_d20;
  Scope **local_d18;
  SourceLocation local_d10;
  SourceLibrary **local_d08;
  CellOverride *local_d00;
  const_iterator local_cf8;
  char_pointer local_ce8;
  table_element_pointer local_ce0;
  string_view *local_cd8;
  undefined1 *local_cd0;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_cc8;
  basic_string_view<char,_std::char_traits<char>_> *local_cb0;
  InstanceOverride *local_ca8;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_ca0;
  string_view *local_c88;
  char **local_c80;
  type *local_c78;
  undefined1 *local_c70;
  char_pointer local_c68;
  table_element_pointer local_c60;
  string_view *local_c58;
  Scope **local_c50;
  char_pointer local_c48;
  table_element_pointer local_c40;
  SourceLibrary **local_c38;
  CellOverride *local_c30;
  char_pointer local_c28;
  table_element_pointer local_c20;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_c18;
  ConfigBlockSymbol **local_c00;
  Symbol *local_bf8;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_bf0;
  SyntaxNode **local_bd8;
  Symbol *local_bd0;
  undefined1 local_bc1;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
  local_bc0;
  SourceLocation local_bb8;
  basic_string_view<char,_std::char_traits<char>_> *local_bb0;
  undefined1 *local_ba8;
  bool local_b99 [25];
  iterator local_b80;
  bool local_b69 [25];
  iterator local_b50;
  bool local_b39;
  iterator local_b38;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>
  local_b28;
  size_t local_b10;
  size_t local_b08;
  basic_string_view<char,_std::char_traits<char>_> *local_b00;
  SourceLocation local_af8;
  basic_string_view<char,_std::char_traits<char>_> *local_af0;
  undefined1 *local_ae8;
  undefined1 *local_ae0;
  uint local_ad4;
  value_type *local_ad0;
  value_type *local_ac8;
  uint local_abc;
  group_type *local_ab8;
  size_t local_ab0;
  pow2_quadratic_prober local_aa8;
  size_t local_a98;
  size_t local_a90;
  basic_string_view<char,_std::char_traits<char>_> *local_a88;
  undefined1 *local_a80;
  undefined1 local_a71;
  string_view *local_a70;
  Scope **local_a68;
  bool local_a59 [25];
  iterator local_a40;
  bool local_a29 [25];
  iterator local_a10;
  bool local_9f9;
  iterator local_9f8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>
  local_9e8;
  size_t local_9d0;
  size_t local_9c8;
  basic_string_view<char,_std::char_traits<char>_> *local_9c0;
  string_view *local_9b8;
  undefined1 *local_9b0;
  Scope **local_9a8;
  uint local_99c;
  value_type *local_998;
  value_type *local_990;
  uint local_984;
  group_type *local_980;
  size_t local_978;
  pow2_quadratic_prober local_970;
  size_t local_960;
  size_t local_958;
  basic_string_view<char,_std::char_traits<char>_> *local_950;
  Scope **local_948;
  undefined1 local_939;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>,_const_slang::SourceLibrary_*&,_void>
  local_938;
  SourceLocation local_930;
  SourceLibrary **local_928;
  CellOverride *local_920;
  bool local_911 [25];
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>_conflict
  local_8f8;
  bool local_8e1 [25];
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>_conflict
  local_8c8;
  bool local_8b1;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>_conflict
  local_8b0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>
  local_8a0;
  size_t local_888;
  size_t local_880;
  SourceLibrary **local_878;
  SourceLocation local_870;
  SourceLibrary **local_868;
  undefined1 *local_860;
  CellOverride *local_858;
  uint local_84c;
  value_type *local_848;
  value_type *local_840;
  uint local_834;
  group_type *local_830;
  size_t local_828;
  pow2_quadratic_prober local_820;
  size_t local_810;
  size_t local_808;
  SourceLibrary **local_800;
  CellOverride *local_7f8;
  string_view *local_7f0;
  undefined1 *local_7e8;
  char_pointer local_7e0;
  table_element_pointer local_7d8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_7d0;
  string_view *local_7c0;
  undefined1 *local_7b8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_7b0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>
  local_7a0;
  string_view *local_788;
  undefined1 *local_780;
  iterator local_778;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>
  local_768;
  type *local_750;
  undefined1 *local_748;
  iterator local_740;
  size_t local_730;
  type *local_728;
  undefined1 *local_720;
  uint local_714;
  value_type *local_710;
  value_type *local_708;
  uint local_6fc;
  group_type *local_6f8;
  size_t local_6f0;
  pow2_quadratic_prober local_6e8;
  size_t local_6d8;
  size_t local_6d0;
  type *local_6c8;
  undefined1 *local_6c0;
  size_t local_6b8;
  string_view *local_6b0;
  undefined1 *local_6a8;
  uint local_69c;
  value_type *local_698;
  value_type *local_690;
  uint local_684;
  group_type *local_680;
  size_t local_678;
  pow2_quadratic_prober local_670;
  size_t local_660;
  size_t local_658;
  string_view *local_650;
  undefined1 *local_648;
  undefined1 local_639;
  string_view *local_638;
  char **local_630;
  undefined1 local_621;
  basic_string_view<char,_std::char_traits<char>_> *local_620;
  InstanceOverride *local_618;
  bool local_609 [25];
  iterator local_5f0;
  bool local_5d9 [25];
  iterator local_5c0;
  bool local_5a9;
  iterator local_5a8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>
  local_598;
  size_t local_580;
  size_t local_578;
  basic_string_view<char,_std::char_traits<char>_> *local_570;
  basic_string_view<char,_std::char_traits<char>_> *local_568;
  undefined1 *local_560;
  InstanceOverride *local_558;
  bool local_549 [25];
  iterator local_530;
  bool local_519 [25];
  iterator local_500;
  bool local_4e9;
  iterator local_4e8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>
  local_4d8;
  size_t local_4c0;
  size_t local_4b8;
  basic_string_view<char,_std::char_traits<char>_> *local_4b0;
  string_view *local_4a8;
  undefined1 *local_4a0;
  char **local_498;
  uint local_48c;
  value_type *local_488;
  value_type *local_480;
  uint local_474;
  group_type *local_470;
  size_t local_468;
  pow2_quadratic_prober local_460;
  size_t local_450;
  size_t local_448;
  basic_string_view<char,_std::char_traits<char>_> *local_440;
  char **local_438;
  uint local_42c;
  value_type *local_428;
  value_type *local_420;
  uint local_414;
  group_type *local_410;
  size_t local_408;
  pow2_quadratic_prober local_400;
  size_t local_3f0;
  size_t local_3e8;
  basic_string_view<char,_std::char_traits<char>_> *local_3e0;
  InstanceOverride *local_3d8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>
  local_3d0;
  string_view *local_3b8;
  Scope **local_3b0;
  iterator local_3a8;
  size_t local_398;
  string_view *local_390;
  Scope **local_388;
  uint local_37c;
  value_type *local_378;
  value_type *local_370;
  uint local_364;
  group_type *local_360;
  size_t local_358;
  pow2_quadratic_prober local_350;
  size_t local_340;
  size_t local_338;
  string_view *local_330;
  Scope **local_328;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>
  local_320;
  SourceLibrary **local_308;
  CellOverride *local_300;
  iterator local_2f8;
  size_t local_2e8;
  SourceLibrary **local_2e0;
  CellOverride *local_2d8;
  uint local_2cc;
  value_type *local_2c8;
  value_type *local_2c0;
  uint local_2b4;
  group_type *local_2b0;
  size_t local_2a8;
  pow2_quadratic_prober local_2a0;
  size_t local_290;
  size_t local_288;
  SourceLibrary **local_280;
  CellOverride *local_278;
  undefined1 local_269;
  SyntaxNode **local_268;
  Symbol *local_260;
  undefined1 local_251;
  ConfigBlockSymbol **local_250;
  Symbol *local_248;
  bool local_239 [25];
  iterator local_220;
  bool local_209 [25];
  iterator local_1f0;
  bool local_1d9;
  iterator local_1d8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>
  local_1c8;
  size_t local_1b0;
  basic_string_view<char,_std::char_traits<char>_> *local_1a8;
  SyntaxNode **local_1a0;
  ConfigBlockSymbol **local_198;
  undefined1 *local_190;
  Symbol *local_188;
  uint local_17c;
  value_type *local_178;
  value_type *local_170;
  uint local_164;
  group_type *local_160;
  size_t local_158;
  pow2_quadratic_prober local_150;
  basic_string_view<char,_std::char_traits<char>_> *local_140;
  size_t local_138;
  SyntaxNode **local_130;
  Symbol *local_128;
  bool local_119 [25];
  iterator local_100;
  bool local_e9 [25];
  iterator local_d0;
  bool local_b9;
  iterator local_b8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>
  local_a8;
  size_t local_90;
  size_t local_88;
  SyntaxNode **local_80;
  SyntaxNode **local_78;
  undefined1 *local_70;
  Symbol *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  SyntaxNode **local_10;
  Symbol *local_8;
  
  *(undefined1 *)&in_RDI[4].indexInScope = 1;
  local_d60[0] = Symbol::getParentScope(in_RDI);
  local_d68 = Scope::getCompilation(local_d60[0]);
  this_00 = Symbol::getSyntax(in_RDI);
  local_d70 = slang::syntax::SyntaxNode::as<slang::syntax::ConfigDeclarationSyntax>(this_00);
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_2UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
  ::SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_2UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
              *)CONCAT17(in_stack_ffffffffffffe677,in_stack_ffffffffffffe670));
  SmallVector<slang::ast::ConfigBlockSymbol::TopCell,_2UL>::SmallVector
            ((SmallVector<slang::ast::ConfigBlockSymbol::TopCell,_2UL> *)0xc1747b);
  local_e48 = &local_d70->topCells;
  local_e50._M_current =
       (ConfigCellIdentifierSyntax **)
       std::span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL> *)
                  in_stack_ffffffffffffe658);
  local_e58 = (ConfigCellIdentifierSyntax **)
              std::span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>::end
                        ((span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>
                          *)in_stack_ffffffffffffe668);
  SVar23.endLoc = in_stack_ffffffffffffe660;
  SVar23.startLoc = in_stack_ffffffffffffe658;
  do {
    bVar5 = __gnu_cxx::
            operator==<slang::syntax::ConfigCellIdentifierSyntax_**,_std::span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::ConfigCellIdentifierSyntax_**,_std::span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>_>
                        *)SVar23.endLoc,
                       (__normal_iterator<slang::syntax::ConfigCellIdentifierSyntax_**,_std::span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>_>
                        *)SVar23.startLoc);
    if (((bVar5 ^ 0xffU) & 1) == 0) {
      local_f38 = local_d68;
      local_f30 = local_d60;
      local_f40 = &local_f38;
      local_f48 = local_d60;
      local_f50 = &local_d70->rules;
      local_f58._M_current =
           (ConfigRuleSyntax **)
           std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>::begin
                     ((span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL> *)
                      SVar23.startLoc);
      local_f60 = (ConfigRuleSyntax **)
                  std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>::end
                            ((span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL> *)
                             in_stack_ffffffffffffe668);
      do {
        bVar5 = __gnu_cxx::
                operator==<slang::syntax::ConfigRuleSyntax_**,_std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>_>
                          ((__normal_iterator<slang::syntax::ConfigRuleSyntax_**,_std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>_>
                            *)SVar23.endLoc,
                           (__normal_iterator<slang::syntax::ConfigRuleSyntax_**,_std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>_>
                            *)SVar23.startLoc);
        if (((bVar5 ^ 0xffU) & 1) == 0) {
          local_11a8 = local_d60;
          local_11b0 = &in_RDI[3].name._M_str;
          local_11c0 = boost::unordered::
                       unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                       ::begin((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                *)0xc19f8e);
          local_11d0 = boost::unordered::
                       unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                       ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                              *)0xc19fab);
          do {
            bVar5 = boost::unordered::detail::foa::operator!=
                              ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                *)SVar23.endLoc,
                               (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                *)SVar23.startLoc);
            if (!bVar5) {
              local_1200 = local_e40;
              local_1208 = SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>::begin
                                     (local_1200);
              local_1210 = SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>::end(local_1200);
              src = extraout_RDX;
              do {
                if (local_1208 == local_1210) {
                  iVar6 = SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>::copy
                                    (local_e40,(EVP_PKEY_CTX *)local_d68,src);
                  local_1288 = CONCAT44(extraout_var,iVar6);
                  std::span<const_slang::ast::ConfigBlockSymbol::TopCell,_18446744073709551615UL>::
                  span<slang::ast::ConfigBlockSymbol::TopCell,_18446744073709551615UL>
                            ((span<const_slang::ast::ConfigBlockSymbol::TopCell,_18446744073709551615UL>
                              *)CONCAT17(in_stack_ffffffffffffe677,in_stack_ffffffffffffe670),
                             in_stack_ffffffffffffe668);
                  *(undefined8 *)(in_RDI + 2) = local_1278;
                  in_RDI[2].name._M_len = local_1270;
                  local_1290 = &in_RDI[2].parentScope;
                  local_12a0 = boost::unordered::
                               unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                               ::begin((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                                        *)0xc1af03);
                  local_12b0 = boost::unordered::
                               unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                               ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                                      *)0xc1af20);
                  do {
                    bVar5 = boost::unordered::detail::foa::operator!=
                                      ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                        *)SVar23.endLoc,
                                       (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                        *)SVar23.startLoc);
                    if (!bVar5) {
                      getInstanceOverrides((ConfigBlockSymbol *)SVar23.endLoc);
                      boost::unordered::
                      unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                      ::begin((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                               *)0xc1bb01);
                      boost::unordered::
                      unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                      ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                             *)0xc1bb1e);
                      while( true ) {
                        bVar5 = boost::unordered::detail::foa::operator!=
                                          ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                                            *)SVar23.endLoc,
                                           (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                                            *)SVar23.startLoc);
                        if (!bVar5) break;
                        boost::unordered::detail::foa::
                        table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                                     *)0xc1bb60);
                        std::
                        get<0ul,std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>
                                  ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>
                                    *)0xc1bb75);
                        std::
                        get<1ul,std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>
                                  ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>
                                    *)0xc1bb8a);
                        registerRules(in_stack_ffffffffffffe6e0,
                                      (InstanceOverride *)in_stack_ffffffffffffe6d8);
                        boost::unordered::detail::foa::
                        table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                                      *)SVar23.endLoc);
                      }
                      SmallVector<slang::ast::ConfigBlockSymbol::TopCell,_2UL>::~SmallVector
                                ((SmallVector<slang::ast::ConfigBlockSymbol::TopCell,_2UL> *)
                                 0xc1bbca);
                      SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_2UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                      ::~SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_2UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                                   *)0xc1bbd7);
                      return;
                    }
                    local_12b8 = boost::unordered::detail::foa::
                                 table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                 ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                              *)0xc1af6b);
                    local_12c0 = std::
                                 get<0ul,std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>
                                           ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>
                                             *)0xc1af80);
                    local_12c8 = std::
                                 get<1ul,std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>
                                           ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>
                                             *)0xc1af95);
                    if (local_12c8->defaultRule != (ConfigRule *)0x0) {
                      pCVar14 = local_12c8->defaultRule;
                      pSVar30 = in_RDI + 4;
                      local_12d0 = not_null::operator_cast_to_SyntaxNode_
                                             ((not_null<const_slang::syntax::SyntaxNode_*> *)
                                              0xc1afe3);
                      local_bd8 = &local_12d0;
                      local_70 = &local_269;
                      local_bd0 = pSVar30;
                      local_268 = local_bd8;
                      local_260 = pSVar30;
                      local_78 = local_bd8;
                      local_68 = pSVar30;
                      local_80 = boost::unordered::detail::foa::
                                 table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                                 ::key_from<slang::syntax::SyntaxNode_const*>(local_bd8);
                      local_88 = boost::unordered::detail::foa::
                                 table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                                 ::hash_for<slang::syntax::SyntaxNode_const*>
                                           ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                             *)SVar23.endLoc,(SyntaxNode **)SVar23.startLoc);
                      local_90 = boost::unordered::detail::foa::
                                 table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                 ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                                 *)SVar23.endLoc,(size_t)SVar23.startLoc);
                      local_10 = local_80;
                      local_20 = local_88;
                      local_18 = local_90;
                      local_8 = pSVar30;
                      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                                (&local_30,local_90);
                      do {
                        local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get
                                             (&local_30);
                        local_40 = boost::unordered::detail::foa::
                                   table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                   ::groups((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                             *)0xc1b177);
                        local_40 = local_40 + local_38;
                        local_44 = boost::unordered::detail::foa::
                                   group15<boost::unordered::detail::foa::plain_integral>::match
                                             ((group15<boost::unordered::detail::foa::plain_integral>
                                               *)in_stack_ffffffffffffe668,(size_t)SVar23.endLoc);
                        if (local_44 != 0) {
                          local_50 = boost::unordered::detail::foa::
                                     table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                     ::elements((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                                 *)0xc1b1d5);
                          local_58 = local_50 + local_38 * 0xf;
                          do {
                            local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                            this_01 = boost::unordered::detail::foa::
                                      table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                      ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                              *)0xc1b228);
                            ppSVar4 = local_10;
                            ppSVar21 = boost::unordered::detail::foa::
                                       table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                                       ::
                                       key_from<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>
                                                 ((
                                                  pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>
                                                  *)0xc1b25b);
                            bVar5 = std::equal_to<const_slang::syntax::SyntaxNode_*>::operator()
                                              (this_01,ppSVar4,ppSVar21);
                            if (bVar5) {
                              boost::unordered::detail::foa::
                              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>
                              ::table_locator(&local_a8,local_40,local_5c,local_58 + local_5c);
                              goto LAB_00c1b377;
                            }
                            local_44 = local_44 - 1 & local_44;
                          } while (local_44 != 0);
                        }
                        bVar5 = boost::unordered::detail::foa::
                                group15<boost::unordered::detail::foa::plain_integral>::
                                is_not_overflowed((
                                                  group15<boost::unordered::detail::foa::plain_integral>
                                                  *)SVar23.endLoc,(size_t)SVar23.startLoc);
                        if (bVar5) {
                          memset(&local_a8,0,0x18);
                          boost::unordered::detail::foa::
                          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>
                          ::table_locator(&local_a8);
                          goto LAB_00c1b377;
                        }
                        bVar5 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                          (&local_30,in_RDI[4].name._M_len);
                      } while (bVar5);
                      memset(&local_a8,0,0x18);
                      boost::unordered::detail::foa::
                      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>
                      ::table_locator(&local_a8);
LAB_00c1b377:
                      bVar5 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                                        ((table_locator *)&local_a8);
                      if (bVar5) {
                        local_b8 = boost::unordered::detail::foa::
                                   table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                   ::make_iterator((locator *)0xc1b397);
                        local_b9 = false;
                        std::
                        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                        ::
                        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                                  (&local_bf0,&local_b8,&local_b9);
                      }
                      else if (in_RDI[4].nextInScope < (Symbol *)in_RDI[4].parentScope) {
                        boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                        ::
                        unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                                  ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                    *)in_stack_ffffffffffffe690,
                                   CONCAT17(in_stack_ffffffffffffe68f,in_stack_ffffffffffffe688),
                                   (size_t)in_stack_ffffffffffffe680,
                                   (try_emplace_args_t *)in_stack_ffffffffffffe678,
                                   (SyntaxNode **)
                                   CONCAT17(in_stack_ffffffffffffe677,in_stack_ffffffffffffe670));
                        local_d0 = boost::unordered::detail::foa::
                                   table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                   ::make_iterator((locator *)0xc1b427);
                        local_e9[0] = true;
                        std::
                        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                        ::
                        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                                  (&local_bf0,&local_d0,local_e9);
                      }
                      else {
                        boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                        ::
                        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                                  ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                    *)in_stack_ffffffffffffe6e0,(size_t)in_stack_ffffffffffffe6d8,
                                   (try_emplace_args_t *)in_stack_ffffffffffffe6d0,
                                   (SyntaxNode **)in_stack_ffffffffffffe6c8);
                        local_100 = boost::unordered::detail::foa::
                                    table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                    ::make_iterator((locator *)0xc1b49a);
                        local_119[0] = true;
                        std::
                        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                        ::
                        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                                  (&local_bf0,&local_100,local_119);
                      }
                      ppVar22 = boost::unordered::detail::foa::
                                table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                              *)SVar23.endLoc);
                      ppVar22->second = pCVar14;
                    }
                    local_12d8 = local_12c8;
                    local_12e8 = boost::unordered::
                                 unordered_flat_map<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                 ::begin((unordered_flat_map<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                          *)0xc1b51c);
                    local_12f8 = boost::unordered::
                                 unordered_flat_map<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                 ::end((unordered_flat_map<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                        *)0xc1b539);
                    while( true ) {
                      bVar5 = boost::unordered::detail::foa::operator!=
                                        ((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>_conflict
                                          *)SVar23.endLoc,
                                         (table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>_conflict
                                          *)SVar23.startLoc);
                      if (!bVar5) break;
                      local_1300 = boost::unordered::detail::foa::
                                   table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                   ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>_conflict
                                                *)0xc1b584);
                      local_1308 = std::
                                   get<0ul,slang::SourceLibrary_const*const,slang::ast::ConfigRule*>
                                             ((pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>
                                               *)0xc1b599);
                      local_1310 = std::
                                   get<1ul,slang::SourceLibrary_const*const,slang::ast::ConfigRule*>
                                             ((pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>
                                               *)0xc1b5ae);
                      in_stack_ffffffffffffe6d0 = *local_1310;
                      pSVar31 = in_RDI + 4;
                      in_stack_ffffffffffffe6e0 =
                           (ConfigBlockSymbol *)
                           not_null::operator_cast_to_SyntaxNode_
                                     ((not_null<const_slang::syntax::SyntaxNode_*> *)0xc1b5e8);
                      local_c00 = &local_1318;
                      local_190 = &local_251;
                      in_stack_ffffffffffffe6d8 = pSVar31;
                      local_1318 = in_stack_ffffffffffffe6e0;
                      local_bf8 = pSVar31;
                      local_250 = local_c00;
                      local_248 = pSVar31;
                      local_198 = local_c00;
                      local_188 = pSVar31;
                      local_1a0 = boost::unordered::detail::foa::
                                  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                                  ::key_from<slang::syntax::SyntaxNode_const*>(local_c00);
                      in_stack_ffffffffffffe6c8 =
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           boost::unordered::detail::foa::
                           table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                           ::hash_for<slang::syntax::SyntaxNode_const*>
                                     ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                       *)SVar23.endLoc,(SyntaxNode **)SVar23.startLoc);
                      local_1a8 = in_stack_ffffffffffffe6c8;
                      local_1b0 = boost::unordered::detail::foa::
                                  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                  ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                                  *)SVar23.endLoc,(size_t)SVar23.startLoc);
                      local_130 = local_1a0;
                      local_140 = local_1a8;
                      pSVar30 = pSVar31;
                      local_138 = local_1b0;
                      local_128 = pSVar31;
                      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                                (&local_150,local_1b0);
                      do {
                        local_158 = boost::unordered::detail::foa::pow2_quadratic_prober::get
                                              (&local_150);
                        local_160 = boost::unordered::detail::foa::
                                    table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                    ::groups((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                              *)0xc1b75e);
                        local_160 = local_160 + local_158;
                        local_164 = boost::unordered::detail::foa::
                                    group15<boost::unordered::detail::foa::plain_integral>::match
                                              ((group15<boost::unordered::detail::foa::plain_integral>
                                                *)in_stack_ffffffffffffe668,(size_t)SVar23.endLoc);
                        if (local_164 != 0) {
                          local_170 = boost::unordered::detail::foa::
                                      table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                      ::elements((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                                  *)0xc1b7b3);
                          local_178 = local_170 + local_158 * 0xf;
                          do {
                            local_17c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                            in_stack_ffffffffffffe690 =
                                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                                  *)boost::unordered::detail::foa::
                                    table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                    ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                            *)0xc1b803);
                            ppSVar4 = local_130;
                            ppSVar21 = boost::unordered::detail::foa::
                                       table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                                       ::
                                       key_from<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>
                                                 ((
                                                  pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>
                                                  *)0xc1b830);
                            bVar5 = std::equal_to<const_slang::syntax::SyntaxNode_*>::operator()
                                              ((equal_to<const_slang::syntax::SyntaxNode_*> *)
                                               in_stack_ffffffffffffe690,ppSVar4,ppSVar21);
                            if (bVar5) {
                              boost::unordered::detail::foa::
                              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>
                              ::table_locator(&local_1c8,local_160,local_17c,local_178 + local_17c);
                              goto LAB_00c1b937;
                            }
                            local_164 = local_164 - 1 & local_164;
                          } while (local_164 != 0);
                        }
                        in_stack_ffffffffffffe68f =
                             boost::unordered::detail::foa::
                             group15<boost::unordered::detail::foa::plain_integral>::
                             is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral>
                                                *)SVar23.endLoc,(size_t)SVar23.startLoc);
                        if ((bool)in_stack_ffffffffffffe68f) {
                          memset(&local_1c8,0,0x18);
                          boost::unordered::detail::foa::
                          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>
                          ::table_locator(&local_1c8);
                          goto LAB_00c1b937;
                        }
                        bVar5 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                          (&local_150,(pSVar30->name)._M_len);
                      } while (bVar5);
                      memset(&local_1c8,0,0x18);
                      boost::unordered::detail::foa::
                      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>
                      ::table_locator(&local_1c8);
LAB_00c1b937:
                      bVar5 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                                        ((table_locator *)&local_1c8);
                      if (bVar5) {
                        local_1d8 = boost::unordered::detail::foa::
                                    table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                    ::make_iterator((locator *)0xc1b957);
                        local_1d9 = false;
                        std::
                        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                        ::
                        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                                  (&local_c18,&local_1d8,&local_1d9);
                      }
                      else if (pSVar31->nextInScope < (Symbol *)pSVar31->parentScope) {
                        boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                        ::
                        unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                                  ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                    *)in_stack_ffffffffffffe690,
                                   CONCAT17(in_stack_ffffffffffffe68f,in_stack_ffffffffffffe688),
                                   (size_t)in_stack_ffffffffffffe680,
                                   (try_emplace_args_t *)in_stack_ffffffffffffe678,
                                   (SyntaxNode **)
                                   CONCAT17(in_stack_ffffffffffffe677,in_stack_ffffffffffffe670));
                        local_1f0 = boost::unordered::detail::foa::
                                    table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                    ::make_iterator((locator *)0xc1b9e1);
                        local_209[0] = true;
                        std::
                        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                        ::
                        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                                  (&local_c18,&local_1f0,local_209);
                      }
                      else {
                        boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                        ::
                        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                                  ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                    *)in_stack_ffffffffffffe6e0,(size_t)in_stack_ffffffffffffe6d8,
                                   (try_emplace_args_t *)in_stack_ffffffffffffe6d0,
                                   (SyntaxNode **)in_stack_ffffffffffffe6c8);
                        local_220 = boost::unordered::detail::foa::
                                    table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                    ::make_iterator((locator *)0xc1ba51);
                        local_239[0] = true;
                        std::
                        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                        ::
                        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                                  (&local_c18,&local_220,local_239);
                      }
                      ppVar22 = boost::unordered::detail::foa::
                                table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                              *)SVar23.endLoc);
                      in_stack_ffffffffffffe680 = (Token *)&ppVar22->second;
                      *(type *)in_stack_ffffffffffffe680 = in_stack_ffffffffffffe6d0;
                      boost::unordered::detail::foa::
                      table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                      ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>_conflict
                                    *)SVar23.endLoc);
                    }
                    boost::unordered::detail::foa::
                    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                    ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                  *)SVar23.endLoc);
                  } while( true );
                }
                local_1218 = local_1208;
                if (local_1208->rule == (ConfigRule *)0x0) {
                  ppSVar10 = &in_RDI[2].parentScope;
                  local_c58 = &(local_1208->definition->super_Symbol).name;
                  local_c50 = ppSVar10;
                  local_3b8 = local_c58;
                  local_3b0 = ppSVar10;
                  local_390 = local_c58;
                  local_388 = ppSVar10;
                  local_398 = boost::unordered::detail::foa::
                              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::CellOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>>
                              ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                                        ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                                          *)SVar23.endLoc,
                                         (basic_string_view<char,_std::char_traits<char>_> *)
                                         SVar23.startLoc);
                  psVar3 = local_390;
                  local_338 = boost::unordered::detail::foa::
                              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                              ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                                              *)SVar23.endLoc,(size_t)SVar23.startLoc);
                  local_330 = psVar3;
                  local_340 = local_398;
                  local_328 = ppSVar10;
                  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                            (&local_350,local_338);
                  do {
                    local_358 = boost::unordered::detail::foa::pow2_quadratic_prober::get
                                          (&local_350);
                    local_360 = boost::unordered::detail::foa::
                                table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                                ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                                          *)0xc1a682);
                    local_360 = local_360 + local_358;
                    local_364 = boost::unordered::detail::foa::
                                group15<boost::unordered::detail::foa::plain_integral>::match
                                          ((group15<boost::unordered::detail::foa::plain_integral> *
                                           )in_stack_ffffffffffffe668,(size_t)SVar23.endLoc);
                    if (local_364 != 0) {
                      local_370 = boost::unordered::detail::foa::
                                  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                                  ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                                              *)0xc1a6e0);
                      local_378 = local_370 + local_358 * 0xf;
                      do {
                        local_37c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                        boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                        ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                                *)0xc1a733);
                        boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::CellOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>>
                        ::
                        key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>
                                  ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>
                                    *)0xc1a767);
                        bVar5 = std::
                                equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                                operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                            *)in_stack_ffffffffffffe680,
                                           (basic_string_view<char,_std::char_traits<char>_> *)
                                           in_stack_ffffffffffffe678,
                                           (basic_string_view<char,_std::char_traits<char>_> *)
                                           CONCAT17(in_stack_ffffffffffffe677,
                                                    in_stack_ffffffffffffe670));
                        if (bVar5) {
                          boost::unordered::detail::foa::
                          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>
                          ::table_locator(&local_3d0,local_360,local_37c,local_378 + local_37c);
                          goto LAB_00c1a883;
                        }
                        local_364 = local_364 - 1 & local_364;
                      } while (local_364 != 0);
                    }
                    bVar5 = boost::unordered::detail::foa::
                            group15<boost::unordered::detail::foa::plain_integral>::
                            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral>
                                               *)SVar23.endLoc,(size_t)SVar23.startLoc);
                    if (bVar5) {
                      memset(&local_3d0,0,0x18);
                      boost::unordered::detail::foa::
                      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>
                      ::table_locator(&local_3d0);
                      goto LAB_00c1a883;
                    }
                    bVar5 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                      (&local_350,(size_t)in_RDI[2].nextInScope);
                  } while (bVar5);
                  memset(&local_3d0,0,0x18);
                  boost::unordered::detail::foa::
                  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>
                  ::table_locator(&local_3d0);
LAB_00c1a883:
                  local_3a8 = boost::unordered::detail::foa::
                              table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                              ::make_iterator((locator *)0xc1a892);
                  local_c48 = local_3a8.pc_;
                  local_c40 = local_3a8.p_;
                  local_1228 = local_3a8.pc_;
                  local_1220 = local_3a8.p_;
                  local_1238 = boost::unordered::
                               unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                               ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                                      *)0xc1a936);
                  bVar5 = boost::unordered::detail::foa::operator!=
                                    ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                      *)SVar23.endLoc,
                                     (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                      *)SVar23.startLoc);
                  src = extraout_RDX_00;
                  if (bVar5) {
                    ppVar17 = boost::unordered::detail::foa::
                              table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                              ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                            *)0xc1a989);
                    local_1218->rule = (ppVar17->second).defaultRule;
                    ppVar17 = boost::unordered::detail::foa::
                              table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                              ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                            *)0xc1a9a6);
                    pCVar33 = &ppVar17->second;
                    local_1258 = local_1218->definition->sourceLibrary;
                    local_c38 = &local_1258;
                    local_1240 = pCVar33;
                    local_c30 = pCVar33;
                    local_308 = local_c38;
                    local_300 = pCVar33;
                    local_2e0 = local_c38;
                    local_2d8 = pCVar33;
                    local_2e8 = boost::unordered::detail::foa::
                                table_core<boost::unordered::detail::foa::flat_map_types<slang::SourceLibrary_const*,slang::ast::ConfigRule*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SourceLibrary_const*,void>,std::equal_to<slang::SourceLibrary_const*>,std::allocator<std::pair<slang::SourceLibrary_const*const,slang::ast::ConfigRule*>>>
                                ::hash_for<slang::SourceLibrary_const*>
                                          ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                            *)SVar23.endLoc,(SourceLibrary **)SVar23.startLoc);
                    ppSVar32 = local_2e0;
                    local_288 = boost::unordered::detail::foa::
                                table_core<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                                *)SVar23.endLoc,(size_t)SVar23.startLoc);
                    local_290 = local_2e8;
                    local_280 = ppSVar32;
                    local_278 = pCVar33;
                    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                              (&local_2a0,local_288);
                    do {
                      local_2a8 = boost::unordered::detail::foa::pow2_quadratic_prober::get
                                            (&local_2a0);
                      local_2b0 = boost::unordered::detail::foa::
                                  table_arrays<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                  ::groups((table_arrays<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                            *)0xc1ab19);
                      local_2b0 = local_2b0 + local_2a8;
                      local_2b4 = boost::unordered::detail::foa::
                                  group15<boost::unordered::detail::foa::plain_integral>::match
                                            ((group15<boost::unordered::detail::foa::plain_integral>
                                              *)in_stack_ffffffffffffe668,(size_t)SVar23.endLoc);
                      if (local_2b4 != 0) {
                        local_2c0 = boost::unordered::detail::foa::
                                    table_arrays<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                    ::elements((table_arrays<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                                *)0xc1ab77);
                        local_2c8 = local_2c0 + local_2a8 * 0xf;
                        do {
                          local_2cc = boost::unordered::detail::foa::unchecked_countr_zero(0);
                          peVar18 = boost::unordered::detail::foa::
                                    table_core<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                    ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                            *)0xc1abca);
                          ppSVar32 = local_280;
                          ppSVar19 = boost::unordered::detail::foa::
                                     table_core<boost::unordered::detail::foa::flat_map_types<slang::SourceLibrary_const*,slang::ast::ConfigRule*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SourceLibrary_const*,void>,std::equal_to<slang::SourceLibrary_const*>,std::allocator<std::pair<slang::SourceLibrary_const*const,slang::ast::ConfigRule*>>>
                                     ::
                                     key_from<std::pair<slang::SourceLibrary_const*const,slang::ast::ConfigRule*>>
                                               ((pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>
                                                 *)0xc1abfd);
                          bVar5 = std::equal_to<const_slang::SourceLibrary_*>::operator()
                                            (peVar18,ppSVar32,ppSVar19);
                          if (bVar5) {
                            boost::unordered::detail::foa::
                            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>
                            ::table_locator(&local_320,local_2b0,local_2cc,local_2c8 + local_2cc);
                            goto LAB_00c1ad19;
                          }
                          local_2b4 = local_2b4 - 1 & local_2b4;
                        } while (local_2b4 != 0);
                      }
                      bVar5 = boost::unordered::detail::foa::
                              group15<boost::unordered::detail::foa::plain_integral>::
                              is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral>
                                                 *)SVar23.endLoc,(size_t)SVar23.startLoc);
                      if (bVar5) {
                        memset(&local_320,0,0x18);
                        boost::unordered::detail::foa::
                        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>
                        ::table_locator(&local_320);
                        goto LAB_00c1ad19;
                      }
                      bVar5 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                        (&local_2a0,
                                         (pCVar33->specificLibRules).table_.
                                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                         .arrays.groups_size_mask);
                    } while (bVar5);
                    memset(&local_320,0,0x18);
                    boost::unordered::detail::foa::
                    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>
                    ::table_locator(&local_320);
LAB_00c1ad19:
                    local_2f8 = boost::unordered::detail::foa::
                                table<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                ::make_iterator((locator *)0xc1ad28);
                    local_c28 = local_2f8.pc_;
                    local_c20 = local_2f8.p_;
                    local_1250 = local_2f8.pc_;
                    local_1248 = local_2f8.p_;
                    local_1268 = boost::unordered::
                                 unordered_flat_map<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                 ::end((unordered_flat_map<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                        *)0xc1adc5);
                    bVar5 = boost::unordered::detail::foa::operator!=
                                      ((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>_conflict
                                        *)SVar23.endLoc,
                                       (table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>_conflict
                                        *)SVar23.startLoc);
                    src = extraout_RDX_01;
                    if (bVar5) {
                      ppVar20 = boost::unordered::detail::foa::
                                table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>_conflict
                                              *)0xc1ae0d);
                      local_1218->rule = ppVar20->second;
                      src = extraout_RDX_02;
                    }
                    if (local_1218->rule != (ConfigRule *)0x0) {
                      resolve::anon_class_8_1_a89d2d74::operator()
                                ((anon_class_8_1_a89d2d74 *)in_stack_ffffffffffffe680,
                                 in_stack_ffffffffffffe678);
                      src = extraout_RDX_03;
                    }
                  }
                }
                local_1208 = local_1208 + 1;
              } while( true );
            }
            local_11d8 = boost::unordered::detail::foa::
                         table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                         ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                      *)0xc19ff6);
            local_11e0 = std::
                         get<0ul,std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>
                                   ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>
                                     *)0xc1a00b);
            local_11e8 = std::
                         get<1ul,std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>
                                   ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>
                                     *)0xc1a020);
            if (local_11e8->rule != (ConfigRule *)0x0) {
              local_c78 = local_11e0;
              local_750 = local_11e0;
              local_728 = local_11e0;
              local_c70 = local_db0;
              local_748 = local_db0;
              local_720 = local_db0;
              local_730 = boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,48ul,16ul>>
                          ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                                    ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                                      *)SVar23.endLoc,
                                     (basic_string_view<char,_std::char_traits<char>_> *)
                                     SVar23.startLoc);
              ptVar2 = local_728;
              local_6d0 = boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                          ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                                          *)SVar23.endLoc,(size_t)SVar23.startLoc);
              local_6c8 = ptVar2;
              local_6d8 = local_730;
              local_6c0 = local_db0;
              boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                        (&local_6e8,local_6d0);
              do {
                local_6f0 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_6e8);
                local_6f8 = boost::unordered::detail::foa::
                            table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                            ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                                      *)0xc1a18c);
                local_6f8 = local_6f8 + local_6f0;
                local_6fc = boost::unordered::detail::foa::
                            group15<boost::unordered::detail::foa::plain_integral>::match
                                      ((group15<boost::unordered::detail::foa::plain_integral> *)
                                       in_stack_ffffffffffffe668,(size_t)SVar23.endLoc);
                if (local_6fc != 0) {
                  local_708 = boost::unordered::detail::foa::
                              table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                              ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                                          *)0xc1a1ee);
                  local_710 = local_708 + local_6f0 * 0xf;
                  do {
                    local_714 = boost::unordered::detail::foa::unchecked_countr_zero(0);
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                    ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                            *)0xc1a241);
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,48ul,16ul>>
                    ::
                    key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>>
                              ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
                                *)0xc1a275);
                    bVar5 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                            operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                        *)in_stack_ffffffffffffe680,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       in_stack_ffffffffffffe678,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       CONCAT17(in_stack_ffffffffffffe677,in_stack_ffffffffffffe670)
                                      );
                    if (bVar5) {
                      boost::unordered::detail::foa::
                      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>
                      ::table_locator(&local_768,local_6f8,local_714,local_710 + local_714);
                      goto LAB_00c1a391;
                    }
                    local_6fc = local_6fc - 1 & local_6fc;
                  } while (local_6fc != 0);
                }
                bVar5 = boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                                  ((group15<boost::unordered::detail::foa::plain_integral> *)
                                   SVar23.endLoc,(size_t)SVar23.startLoc);
                if (bVar5) {
                  memset(&local_768,0,0x18);
                  boost::unordered::detail::foa::
                  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>
                  ::table_locator(&local_768);
                  goto LAB_00c1a391;
                }
                bVar5 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                  (&local_6e8,local_da0);
              } while (bVar5);
              memset(&local_768,0,0x18);
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>
              ::table_locator(&local_768);
LAB_00c1a391:
              local_740 = boost::unordered::detail::foa::
                          table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                          ::make_iterator((locator *)0xc1a3a0);
              local_c68 = local_740.pc_;
              local_c60 = local_740.p_;
              local_11f8 = local_740.pc_;
              local_11f0 = local_740.p_;
              resolve::anon_class_8_1_a89d2d74::operator()
                        ((anon_class_8_1_a89d2d74 *)in_stack_ffffffffffffe680,
                         in_stack_ffffffffffffe678);
              pCVar14 = local_11e8->rule;
              ppVar15 = boost::unordered::detail::foa::
                        table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                        ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                      *)SVar23.endLoc);
              pTVar16 = SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>::operator[]
                                  (local_e40,ppVar15->second);
              pTVar16->rule = pCVar14;
            }
            boost::unordered::detail::foa::
            table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
            ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)SVar23.endLoc);
          } while( true );
        }
        ppCVar9 = __gnu_cxx::
                  __normal_iterator<slang::syntax::ConfigRuleSyntax_**,_std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>_>
                  ::operator*(&local_f58);
        local_f68 = &(*ppCVar9)->super_SyntaxNode;
        if (local_f68->kind == CellConfigRule) {
          local_f90 = slang::syntax::SyntaxNode::as<slang::syntax::CellConfigRuleSyntax>(local_f68);
          not_null<slang::syntax::ConfigCellIdentifierSyntax_*>::operator->
                    ((not_null<slang::syntax::ConfigCellIdentifierSyntax_*> *)0xc17f8c);
          sVar26 = parsing::Token::valueText
                             ((Token *)CONCAT17(in_stack_ffffffffffffe677,in_stack_ffffffffffffe670)
                             );
          local_fa0 = sVar26;
          bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_fa0);
          if (!bVar5) {
            not_null<slang::syntax::ConfigRuleClauseSyntax_*>::operator*
                      ((not_null<slang::syntax::ConfigRuleClauseSyntax_*> *)0xc18012);
            resolve::anon_class_8_1_df254053::operator()
                      ((anon_class_8_1_df254053 *)in_stack_ffffffffffffe6e0,
                       (ConfigRuleClauseSyntax *)in_stack_ffffffffffffe6d8);
            local_fa8 = BumpAllocator::emplace<slang::ast::ConfigRule,slang::ast::ConfigRule>
                                  ((BumpAllocator *)SVar23.endLoc,(ConfigRule *)SVar23.startLoc);
            ppSVar10 = &in_RDI[2].parentScope;
            local_d20 = &local_fa0;
            local_9b0 = &local_a71;
            local_d18 = ppSVar10;
            local_a70 = local_d20;
            local_a68 = ppSVar10;
            local_9b8 = local_d20;
            local_9a8 = ppSVar10;
            local_9c0 = boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::CellOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>>
                        ::key_from<std::basic_string_view<char,std::char_traits<char>>>(local_d20);
            local_9c8 = boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::CellOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>>
                        ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                                  ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                                    *)SVar23.endLoc,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   SVar23.startLoc);
            local_9d0 = boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                        ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                                        *)SVar23.endLoc,(size_t)SVar23.startLoc);
            local_950 = local_9c0;
            local_960 = local_9c8;
            local_958 = local_9d0;
            local_948 = ppSVar10;
            boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                      (&local_970,local_9d0);
            do {
              local_978 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_970);
              local_980 = boost::unordered::detail::foa::
                          table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                          ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                                    *)0xc181ea);
              local_980 = local_980 + local_978;
              local_984 = boost::unordered::detail::foa::
                          group15<boost::unordered::detail::foa::plain_integral>::match
                                    ((group15<boost::unordered::detail::foa::plain_integral> *)
                                     in_stack_ffffffffffffe668,(size_t)SVar23.endLoc);
              if (local_984 != 0) {
                local_990 = boost::unordered::detail::foa::
                            table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                            ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                                        *)0xc18248);
                local_998 = local_990 + local_978 * 0xf;
                do {
                  local_99c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                  ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                          *)0xc1829b);
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::CellOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>>
                  ::
                  key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>
                            ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>
                              *)0xc182cf);
                  bVar5 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                          operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                      *)in_stack_ffffffffffffe680,
                                     (basic_string_view<char,_std::char_traits<char>_> *)
                                     in_stack_ffffffffffffe678,
                                     (basic_string_view<char,_std::char_traits<char>_> *)
                                     CONCAT17(in_stack_ffffffffffffe677,in_stack_ffffffffffffe670));
                  if (bVar5) {
                    boost::unordered::detail::foa::
                    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>
                    ::table_locator(&local_9e8,local_980,local_99c,local_998 + local_99c);
                    goto LAB_00c183eb;
                  }
                  local_984 = local_984 - 1 & local_984;
                } while (local_984 != 0);
              }
              bVar5 = boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                                ((group15<boost::unordered::detail::foa::plain_integral> *)
                                 SVar23.endLoc,(size_t)SVar23.startLoc);
              if (bVar5) {
                memset(&local_9e8,0,0x18);
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>
                ::table_locator(&local_9e8);
                goto LAB_00c183eb;
              }
              bVar5 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                (&local_970,(size_t)in_RDI[2].nextInScope);
            } while (bVar5);
            memset(&local_9e8,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>
            ::table_locator(&local_9e8);
LAB_00c183eb:
            bVar5 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                              ((table_locator *)&local_9e8);
            if (bVar5) {
              local_9f8 = boost::unordered::detail::foa::
                          table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                          ::make_iterator((locator *)0xc1840d);
              local_9f9 = false;
              std::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
              ::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                        (&local_d38,&local_9f8,&local_9f9);
            }
            else if (in_RDI[3].name._M_len < *(ulong *)(in_RDI + 3)) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::CellOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>>
              ::
              unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                        ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                          *)in_stack_ffffffffffffe690,
                         CONCAT17(in_stack_ffffffffffffe68f,in_stack_ffffffffffffe688),
                         (size_t)in_stack_ffffffffffffe680,
                         (try_emplace_args_t *)in_stack_ffffffffffffe678,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT17(in_stack_ffffffffffffe677,in_stack_ffffffffffffe670));
              local_a10 = boost::unordered::detail::foa::
                          table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                          ::make_iterator((locator *)0xc1849d);
              local_a29[0] = true;
              std::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
              ::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                        (&local_d38,&local_a10,local_a29);
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::CellOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>>
              ::
              unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                        ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                          *)in_stack_ffffffffffffe6e0,(size_t)in_stack_ffffffffffffe6d8,
                         (try_emplace_args_t *)in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8);
              local_a40 = boost::unordered::detail::foa::
                          table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                          ::make_iterator((locator *)0xc18510);
              local_a59[0] = true;
              std::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
              ::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                        (&local_d38,&local_a40,local_a59);
            }
            ppVar17 = boost::unordered::detail::foa::
                      table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                      ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                    *)0xc18556);
            local_1018 = &ppVar17->second;
            not_null<slang::syntax::ConfigCellIdentifierSyntax_*>::operator->
                      ((not_null<slang::syntax::ConfigCellIdentifierSyntax_*> *)0xc18583);
            sVar26 = parsing::Token::valueText
                               ((Token *)CONCAT17(in_stack_ffffffffffffe677,
                                                  in_stack_ffffffffffffe670));
            local_1028 = sVar26;
            bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_1028);
            if (bVar5) {
              if (local_1018->defaultRule == (ConfigRule *)0x0) {
                local_1018->defaultRule = local_fa8;
              }
              else {
                local_10b8 = &local_fa0;
                const::$_0::operator()
                          (in_stack_ffffffffffffe700,
                           (ConfigRule *)
                           CONCAT17(in_stack_ffffffffffffe6ff,in_stack_ffffffffffffe6f8),
                           in_stack_ffffffffffffe6f0,
                           (anon_class_8_1_b1381c8b *)
                           CONCAT17(in_stack_ffffffffffffe6ef,in_stack_ffffffffffffe6e8));
              }
            }
            else {
              sVar26._M_str = in_stack_ffffffffffffe6b8;
              sVar26._M_len = (size_t)in_stack_ffffffffffffe6b0;
              local_1048 = local_1028;
              local_1030 = Compilation::getSourceLibrary
                                     ((Compilation *)
                                      CONCAT44(in_stack_ffffffffffffe6ac,in_stack_ffffffffffffe6a8),
                                      sVar26);
              pCVar33 = local_1018;
              if (local_1030 == (SourceLibrary *)0x0) {
                local_104c = 0xff0006;
                not_null<slang::syntax::ConfigCellIdentifierSyntax_*>::operator->
                          ((not_null<slang::syntax::ConfigCellIdentifierSyntax_*> *)0xc18667);
                SVar25 = parsing::Token::range(in_stack_ffffffffffffe680);
                SVar27.endLoc = in_stack_ffffffffffffe7a8;
                SVar27.startLoc = in_stack_ffffffffffffe7a0;
                local_1060 = SVar25;
                Scope::addDiag((Scope *)CONCAT17(in_stack_ffffffffffffe79f,in_stack_ffffffffffffe798
                                                ),SUB84((ulong)in_stack_ffffffffffffe7b0 >> 0x20,0),
                               SVar27);
                arg_00._M_len._4_4_ = in_stack_ffffffffffffe6ac;
                arg_00._M_len._0_4_ = in_stack_ffffffffffffe6a8;
                arg_00._M_str = (char *)in_stack_ffffffffffffe6b0;
                local_1078 = local_1028;
                Diagnostic::operator<<(in_stack_ffffffffffffe6a0,arg_00);
              }
              else {
                local_d00 = local_1018;
                local_d08 = &local_1030;
                local_d10 = (SourceLocation)&local_fa8;
                local_920 = local_1018;
                local_930 = local_d10;
                local_928 = local_d08;
                paVar11 = boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                          ::al((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                *)0xc1878b);
                boost::unordered::detail::foa::
                alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>,_const_slang::SourceLibrary_*&,_void>
                ::alloc_cted_or_fwded_key_type(&local_938,paVar11,local_928);
                local_868 = boost::unordered::detail::foa::
                            alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>,_const_slang::SourceLibrary_*&,_void>
                            ::move_or_fwd(&local_938);
                local_858 = pCVar33;
                local_860 = &local_939;
                local_870 = local_930;
                local_878 = boost::unordered::detail::foa::
                            table_core<boost::unordered::detail::foa::flat_map_types<slang::SourceLibrary_const*,slang::ast::ConfigRule*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SourceLibrary_const*,void>,std::equal_to<slang::SourceLibrary_const*>,std::allocator<std::pair<slang::SourceLibrary_const*const,slang::ast::ConfigRule*>>>
                            ::key_from<slang::SourceLibrary_const*,slang::ast::ConfigRule*>
                                      (local_868,local_930);
                local_880 = boost::unordered::detail::foa::
                            table_core<boost::unordered::detail::foa::flat_map_types<slang::SourceLibrary_const*,slang::ast::ConfigRule*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SourceLibrary_const*,void>,std::equal_to<slang::SourceLibrary_const*>,std::allocator<std::pair<slang::SourceLibrary_const*const,slang::ast::ConfigRule*>>>
                            ::hash_for<slang::SourceLibrary_const*>
                                      ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                        *)SVar23.endLoc,(SourceLibrary **)SVar23.startLoc);
                local_888 = boost::unordered::detail::foa::
                            table_core<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                            ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                            *)SVar23.endLoc,(size_t)SVar23.startLoc);
                local_7f8 = pCVar33;
                local_800 = local_878;
                local_810 = local_880;
                local_808 = local_888;
                boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                          (&local_820,local_888);
                do {
                  local_828 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_820);
                  local_830 = boost::unordered::detail::foa::
                              table_arrays<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                              ::groups((table_arrays<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                        *)0xc18905);
                  local_830 = local_830 + local_828;
                  local_834 = boost::unordered::detail::foa::
                              group15<boost::unordered::detail::foa::plain_integral>::match
                                        ((group15<boost::unordered::detail::foa::plain_integral> *)
                                         in_stack_ffffffffffffe668,(size_t)SVar23.endLoc);
                  if (local_834 != 0) {
                    local_840 = boost::unordered::detail::foa::
                                table_arrays<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                ::elements((table_arrays<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                            *)0xc18963);
                    local_848 = local_840 + local_828 * 0xf;
                    do {
                      local_84c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                      peVar18 = boost::unordered::detail::foa::
                                table_core<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                        *)0xc189b6);
                      ppSVar32 = local_800;
                      ppSVar19 = boost::unordered::detail::foa::
                                 table_core<boost::unordered::detail::foa::flat_map_types<slang::SourceLibrary_const*,slang::ast::ConfigRule*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SourceLibrary_const*,void>,std::equal_to<slang::SourceLibrary_const*>,std::allocator<std::pair<slang::SourceLibrary_const*const,slang::ast::ConfigRule*>>>
                                 ::
                                 key_from<std::pair<slang::SourceLibrary_const*const,slang::ast::ConfigRule*>>
                                           ((pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>
                                             *)0xc189e9);
                      bVar5 = std::equal_to<const_slang::SourceLibrary_*>::operator()
                                        (peVar18,ppSVar32,ppSVar19);
                      if (bVar5) {
                        boost::unordered::detail::foa::
                        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>
                        ::table_locator(&local_8a0,local_830,local_84c,local_848 + local_84c);
                        goto LAB_00c18b05;
                      }
                      local_834 = local_834 - 1 & local_834;
                    } while (local_834 != 0);
                  }
                  bVar5 = boost::unordered::detail::foa::
                          group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                                    ((group15<boost::unordered::detail::foa::plain_integral> *)
                                     SVar23.endLoc,(size_t)SVar23.startLoc);
                  if (bVar5) {
                    memset(&local_8a0,0,0x18);
                    boost::unordered::detail::foa::
                    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>
                    ::table_locator(&local_8a0);
                    goto LAB_00c18b05;
                  }
                  bVar5 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                    (&local_820,
                                     (pCVar33->specificLibRules).table_.
                                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                     .arrays.groups_size_mask);
                } while (bVar5);
                memset(&local_8a0,0,0x18);
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>
                ::table_locator(&local_8a0);
LAB_00c18b05:
                bVar5 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                                  ((table_locator *)&local_8a0);
                SVar29 = SVar23.endLoc;
                if (bVar5) {
                  local_8b0 = (table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>_conflict
                               )boost::unordered::detail::foa::
                                table<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                ::make_iterator((locator *)0xc18b27);
                  local_8b1 = false;
                  std::
                  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                  ::
                  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                            (&local_1090,&local_8b0,&local_8b1);
                }
                else if ((pCVar33->specificLibRules).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                         .size_ctrl.size <
                         (pCVar33->specificLibRules).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                         .size_ctrl.ml) {
                  SVar28 = local_870;
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::SourceLibrary_const*,slang::ast::ConfigRule*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SourceLibrary_const*,void>,std::equal_to<slang::SourceLibrary_const*>,std::allocator<std::pair<slang::SourceLibrary_const*const,slang::ast::ConfigRule*>>>
                  ::
                  unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::SourceLibrary_const*&,slang::ast::ConfigRule*&>
                            ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                              *)in_stack_ffffffffffffe690,
                             CONCAT17(in_stack_ffffffffffffe68f,in_stack_ffffffffffffe688),
                             (size_t)in_stack_ffffffffffffe680,
                             (try_emplace_args_t *)in_stack_ffffffffffffe678,
                             (SourceLibrary **)
                             CONCAT17(in_stack_ffffffffffffe677,in_stack_ffffffffffffe670),
                             (ConfigRule **)in_stack_ffffffffffffe6a0);
                  local_8c8 = (table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>_conflict
                               )boost::unordered::detail::foa::
                                table<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                ::make_iterator((locator *)0xc18bc9);
                  local_8e1[0] = true;
                  std::
                  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                  ::
                  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                            (&local_1090,&local_8c8,local_8e1);
                  SVar23.endLoc = SVar29;
                  SVar23.startLoc = SVar28;
                }
                else {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::SourceLibrary_const*,slang::ast::ConfigRule*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SourceLibrary_const*,void>,std::equal_to<slang::SourceLibrary_const*>,std::allocator<std::pair<slang::SourceLibrary_const*const,slang::ast::ConfigRule*>>>
                  ::
                  unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::SourceLibrary_const*&,slang::ast::ConfigRule*&>
                            ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                              *)in_stack_ffffffffffffe6f0,
                             CONCAT17(in_stack_ffffffffffffe6ef,in_stack_ffffffffffffe6e8),
                             (try_emplace_args_t *)in_stack_ffffffffffffe6e0,
                             (SourceLibrary **)in_stack_ffffffffffffe6d8,
                             (ConfigRule **)in_stack_ffffffffffffe6d0);
                  local_8f8 = (table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>_conflict
                               )boost::unordered::detail::foa::
                                table<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                                ::make_iterator((locator *)0xc18c44);
                  local_911[0] = true;
                  std::
                  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                  ::
                  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                            (&local_1090,&local_8f8,local_911);
                }
                local_1098 = std::
                             get<0ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::SourceLibrary_const*,slang::ast::ConfigRule*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                                       ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                                         *)0xc18c8c);
                local_10a0 = std::
                             get<1ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::SourceLibrary_const*,slang::ast::ConfigRule*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                                       ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                                         *)0xc18ca1);
                if ((*local_10a0 & 1U) == 0) {
                  boost::unordered::detail::foa::
                  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                  ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>_conflict
                                *)0xc18cc3);
                  local_10b0 = &local_1030;
                  local_10a8 = &local_fa0;
                  const::$_0::operator()
                            (in_stack_ffffffffffffe700,
                             (ConfigRule *)
                             CONCAT17(in_stack_ffffffffffffe6ff,in_stack_ffffffffffffe6f8),
                             in_stack_ffffffffffffe6f0,
                             (anon_class_16_2_2c372971 *)
                             CONCAT17(in_stack_ffffffffffffe6ef,in_stack_ffffffffffffe6e8));
                }
              }
            }
          }
        }
        else if (local_f68->kind == DefaultConfigRule) {
          slang::syntax::SyntaxNode::as<slang::syntax::DefaultConfigRuleSyntax>(local_f68);
          not_null<slang::syntax::ConfigLiblistSyntax_*>::operator*
                    ((not_null<slang::syntax::ConfigLiblistSyntax_*> *)0xc17ec3);
          sVar24 = resolve::anon_class_16_2_f7902cf0::operator()
                             (in_stack_ffffffffffffe780,in_stack_ffffffffffffe778);
          local_f88 = sVar24;
          std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>::
          span<const_slang::SourceLibrary_*,_18446744073709551615UL>
                    ((span<const_slang::SourceLibrary_*const,_18446744073709551615UL> *)
                     CONCAT17(in_stack_ffffffffffffe677,in_stack_ffffffffffffe670),
                     (span<const_slang::SourceLibrary_*,_18446744073709551615UL> *)
                     in_stack_ffffffffffffe668);
          in_RDI[2].name._M_str = local_f78;
          in_RDI[2].location = local_f70;
        }
        else {
          local_10c0 = slang::syntax::SyntaxNode::as<slang::syntax::InstanceConfigRuleSyntax>
                                 (local_f68);
          sVar26 = parsing::Token::valueText
                             ((Token *)CONCAT17(in_stack_ffffffffffffe677,in_stack_ffffffffffffe670)
                             );
          local_10d0 = sVar26;
          bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_10d0);
          if (!bVar5) {
            local_cd8 = &local_10d0;
            local_cd0 = local_db0;
            local_7f0 = local_cd8;
            local_7e8 = local_db0;
            local_7c0 = local_cd8;
            local_7b8 = local_db0;
            local_788 = local_cd8;
            local_780 = local_db0;
            local_6b0 = local_cd8;
            local_6a8 = local_db0;
            local_6b8 = boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,48ul,16ul>>
                        ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                                  ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                                    *)SVar23.endLoc,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   SVar23.startLoc);
            psVar3 = local_6b0;
            local_658 = boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                        ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                                        *)SVar23.endLoc,(size_t)SVar23.startLoc);
            local_650 = psVar3;
            local_660 = local_6b8;
            local_648 = local_db0;
            boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                      (&local_670,local_658);
            do {
              local_678 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_670);
              local_680 = boost::unordered::detail::foa::
                          table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                          ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                                    *)0xc18f8c);
              local_680 = local_680 + local_678;
              local_684 = boost::unordered::detail::foa::
                          group15<boost::unordered::detail::foa::plain_integral>::match
                                    ((group15<boost::unordered::detail::foa::plain_integral> *)
                                     in_stack_ffffffffffffe668,(size_t)SVar23.endLoc);
              if (local_684 != 0) {
                local_690 = boost::unordered::detail::foa::
                            table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                            ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                                        *)0xc18fee);
                local_698 = local_690 + local_678 * 0xf;
                do {
                  local_69c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                  ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                          *)0xc19041);
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,48ul,16ul>>
                  ::
                  key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>>
                            ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
                              *)0xc19075);
                  bVar5 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                          operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                      *)in_stack_ffffffffffffe680,
                                     (basic_string_view<char,_std::char_traits<char>_> *)
                                     in_stack_ffffffffffffe678,
                                     (basic_string_view<char,_std::char_traits<char>_> *)
                                     CONCAT17(in_stack_ffffffffffffe677,in_stack_ffffffffffffe670));
                  if (bVar5) {
                    boost::unordered::detail::foa::
                    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>
                    ::table_locator(&local_7a0,local_680,local_69c,local_698 + local_69c);
                    goto LAB_00c19191;
                  }
                  local_684 = local_684 - 1 & local_684;
                } while (local_684 != 0);
              }
              bVar5 = boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                                ((group15<boost::unordered::detail::foa::plain_integral> *)
                                 SVar23.endLoc,(size_t)SVar23.startLoc);
              if (bVar5) {
                memset(&local_7a0,0,0x18);
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>
                ::table_locator(&local_7a0);
                goto LAB_00c19191;
              }
              bVar5 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                (&local_670,local_da0);
            } while (bVar5);
            memset(&local_7a0,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>
            ::table_locator(&local_7a0);
LAB_00c19191:
            local_778 = boost::unordered::detail::foa::
                        table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                        ::make_iterator((locator *)0xc191a0);
            local_7d0.pc_ = local_778.pc_;
            local_7d0.p_ = local_778.p_;
            boost::unordered::detail::foa::
            table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
            ::table_iterator<false,_nullptr>(&local_7b0,&local_7d0);
            local_7e0 = local_7b0.pc_;
            local_7d8 = local_7b0.p_;
            local_ce8 = local_7b0.pc_;
            local_ce0 = local_7b0.p_;
            local_cf8 = boost::unordered::
                        unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                        ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                               *)0xc19292);
            bVar5 = boost::unordered::detail::foa::operator!=
                              ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                                *)SVar23.endLoc,
                               (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                                *)SVar23.startLoc);
            if (bVar5) {
              local_10e9 = 0;
              ppcVar12 = &in_RDI[3].name._M_str;
              local_c88 = &local_10d0;
              local_4a0 = &local_639;
              local_c80 = ppcVar12;
              local_638 = local_c88;
              local_630 = ppcVar12;
              local_4a8 = local_c88;
              local_498 = ppcVar12;
              local_4b0 = boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                          ::key_from<std::basic_string_view<char,std::char_traits<char>>>(local_c88)
              ;
              local_4b8 = boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                          ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                                    ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                      *)SVar23.endLoc,
                                     (basic_string_view<char,_std::char_traits<char>_> *)
                                     SVar23.startLoc);
              local_4c0 = boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                          ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                          *)SVar23.endLoc,(size_t)SVar23.startLoc);
              local_440 = local_4b0;
              local_450 = local_4b8;
              local_448 = local_4c0;
              local_438 = ppcVar12;
              boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                        (&local_460,local_4c0);
              do {
                local_468 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_460);
                local_470 = boost::unordered::detail::foa::
                            table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                            ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                      *)0xc194e4);
                local_470 = local_470 + local_468;
                local_474 = boost::unordered::detail::foa::
                            group15<boost::unordered::detail::foa::plain_integral>::match
                                      ((group15<boost::unordered::detail::foa::plain_integral> *)
                                       in_stack_ffffffffffffe668,(size_t)SVar23.endLoc);
                if (local_474 != 0) {
                  local_480 = boost::unordered::detail::foa::
                              table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                              ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                          *)0xc19542);
                  local_488 = local_480 + local_468 * 0xf;
                  do {
                    local_48c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                    ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                            *)0xc19595);
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                    ::
                    key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>
                              ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>
                                *)0xc195c9);
                    bVar5 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                            operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                        *)in_stack_ffffffffffffe680,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       in_stack_ffffffffffffe678,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       CONCAT17(in_stack_ffffffffffffe677,in_stack_ffffffffffffe670)
                                      );
                    if (bVar5) {
                      boost::unordered::detail::foa::
                      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>
                      ::table_locator(&local_4d8,local_470,local_48c,local_488 + local_48c);
                      goto LAB_00c196e5;
                    }
                    local_474 = local_474 - 1 & local_474;
                  } while (local_474 != 0);
                }
                bVar5 = boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                                  ((group15<boost::unordered::detail::foa::plain_integral> *)
                                   SVar23.endLoc,(size_t)SVar23.startLoc);
                if (bVar5) {
                  memset(&local_4d8,0,0x18);
                  boost::unordered::detail::foa::
                  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>
                  ::table_locator(&local_4d8);
                  goto LAB_00c196e5;
                }
                bVar5 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                  (&local_460,(size_t)in_RDI[3].location);
              } while (bVar5);
              memset(&local_4d8,0,0x18);
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>
              ::table_locator(&local_4d8);
LAB_00c196e5:
              bVar5 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                                ((table_locator *)&local_4d8);
              if (bVar5) {
                local_4e8 = boost::unordered::detail::foa::
                            table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                            ::make_iterator((locator *)0xc19707);
                local_4e9 = false;
                std::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                ::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                          (&local_ca0,&local_4e8,&local_4e9);
              }
              else if (in_RDI[3].originatingSyntax < *(SyntaxNode **)&in_RDI[3].indexInScope) {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                ::
                unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                          ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                            *)in_stack_ffffffffffffe690,
                           CONCAT17(in_stack_ffffffffffffe68f,in_stack_ffffffffffffe688),
                           (size_t)in_stack_ffffffffffffe680,
                           (try_emplace_args_t *)in_stack_ffffffffffffe678,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT17(in_stack_ffffffffffffe677,in_stack_ffffffffffffe670));
                local_500 = boost::unordered::detail::foa::
                            table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                            ::make_iterator((locator *)0xc19797);
                local_519[0] = true;
                std::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                ::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                          (&local_ca0,&local_500,local_519);
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                ::
                unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                          ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                            *)in_stack_ffffffffffffe6e0,(size_t)in_stack_ffffffffffffe6d8,
                           (try_emplace_args_t *)in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8
                          );
                local_530 = boost::unordered::detail::foa::
                            table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                            ::make_iterator((locator *)0xc1980a);
                local_549[0] = true;
                std::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                ::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                          (&local_ca0,&local_530,local_549);
              }
              ppVar13 = boost::unordered::detail::foa::
                        table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                        ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                      *)0xc19850);
              local_10f8 = &ppVar13->second;
              local_1100 = &local_10c0->instanceNames;
              local_1108._M_current =
                   (ConfigInstanceIdentifierSyntax **)
                   std::
                   span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>::
                   begin((span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>
                          *)SVar23.startLoc);
              local_1110 = (ConfigInstanceIdentifierSyntax **)
                           std::
                           span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>
                           ::end((span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>
                                  *)in_stack_ffffffffffffe668);
              while( true ) {
                bVar5 = __gnu_cxx::
                        operator==<slang::syntax::ConfigInstanceIdentifierSyntax_**,_std::span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>_>
                                  ((__normal_iterator<slang::syntax::ConfigInstanceIdentifierSyntax_**,_std::span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>_>
                                    *)SVar23.endLoc,
                                   (__normal_iterator<slang::syntax::ConfigInstanceIdentifierSyntax_**,_std::span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>_>
                                    *)SVar23.startLoc);
                if (((bVar5 ^ 0xffU) & 1) == 0) break;
                local_1118 = __gnu_cxx::
                             __normal_iterator<slang::syntax::ConfigInstanceIdentifierSyntax_**,_std::span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>_>
                             ::operator*(&local_1108);
                sVar26 = parsing::Token::valueText
                                   ((Token *)CONCAT17(in_stack_ffffffffffffe677,
                                                      in_stack_ffffffffffffe670));
                local_1128 = sVar26;
                bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_1128);
                pIVar1 = local_10f8;
                local_10e9 = local_10e9 & 1 | bVar5;
                local_ca8 = local_10f8;
                local_618 = local_10f8;
                local_558 = local_10f8;
                local_560 = &local_621;
                local_cb0 = &local_1128;
                local_620 = &local_1128;
                local_568 = &local_1128;
                local_570 = boost::unordered::detail::foa::
                            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                            ::key_from<std::basic_string_view<char,std::char_traits<char>>>
                                      (&local_1128);
                local_578 = boost::unordered::detail::foa::
                            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                            ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                                      ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                        *)SVar23.endLoc,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       SVar23.startLoc);
                local_580 = boost::unordered::detail::foa::
                            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                            ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                            *)SVar23.endLoc,(size_t)SVar23.startLoc);
                local_3d8 = pIVar1;
                local_3e0 = local_570;
                local_3f0 = local_578;
                local_3e8 = local_580;
                boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                          (&local_400,local_580);
                do {
                  local_408 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_400);
                  local_410 = boost::unordered::detail::foa::
                              table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                              ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                        *)0xc19ad1);
                  local_410 = local_410 + local_408;
                  local_414 = boost::unordered::detail::foa::
                              group15<boost::unordered::detail::foa::plain_integral>::match
                                        ((group15<boost::unordered::detail::foa::plain_integral> *)
                                         in_stack_ffffffffffffe668,(size_t)SVar23.endLoc);
                  if (local_414 != 0) {
                    local_420 = boost::unordered::detail::foa::
                                table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                            *)0xc19b2f);
                    local_428 = local_420 + local_408 * 0xf;
                    do {
                      local_42c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                      boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                      ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                              *)0xc19b82);
                      boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                      ::
                      key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>
                                ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>
                                  *)0xc19bb6);
                      bVar5 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                              ::operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                            *)in_stack_ffffffffffffe680,
                                           (basic_string_view<char,_std::char_traits<char>_> *)
                                           in_stack_ffffffffffffe678,
                                           (basic_string_view<char,_std::char_traits<char>_> *)
                                           CONCAT17(in_stack_ffffffffffffe677,
                                                    in_stack_ffffffffffffe670));
                      if (bVar5) {
                        boost::unordered::detail::foa::
                        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>
                        ::table_locator(&local_598,local_410,local_42c,local_428 + local_42c);
                        goto LAB_00c19cd2;
                      }
                      local_414 = local_414 - 1 & local_414;
                    } while (local_414 != 0);
                  }
                  bVar5 = boost::unordered::detail::foa::
                          group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                                    ((group15<boost::unordered::detail::foa::plain_integral> *)
                                     SVar23.endLoc,(size_t)SVar23.startLoc);
                  if (bVar5) {
                    memset(&local_598,0,0x18);
                    boost::unordered::detail::foa::
                    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>
                    ::table_locator(&local_598);
                    goto LAB_00c19cd2;
                  }
                  bVar5 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                    (&local_400,
                                     (pIVar1->childNodes).table_.
                                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                     .arrays.groups_size_mask);
                } while (bVar5);
                memset(&local_598,0,0x18);
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>
                ::table_locator(&local_598);
LAB_00c19cd2:
                bVar5 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                                  ((table_locator *)&local_598);
                if (bVar5) {
                  local_5a8 = boost::unordered::detail::foa::
                              table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                              ::make_iterator((locator *)0xc19cf4);
                  local_5a9 = false;
                  std::
                  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                  ::
                  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                            (&local_cc8,&local_5a8,&local_5a9);
                }
                else if ((pIVar1->childNodes).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                         .size_ctrl.size <
                         (pIVar1->childNodes).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                         .size_ctrl.ml) {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                  ::
                  unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                            ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                              *)in_stack_ffffffffffffe690,
                             CONCAT17(in_stack_ffffffffffffe68f,in_stack_ffffffffffffe688),
                             (size_t)in_stack_ffffffffffffe680,
                             (try_emplace_args_t *)in_stack_ffffffffffffe678,
                             (basic_string_view<char,_std::char_traits<char>_> *)
                             CONCAT17(in_stack_ffffffffffffe677,in_stack_ffffffffffffe670));
                  local_5c0 = boost::unordered::detail::foa::
                              table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                              ::make_iterator((locator *)0xc19d84);
                  local_5d9[0] = true;
                  std::
                  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                  ::
                  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                            (&local_cc8,&local_5c0,local_5d9);
                }
                else {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                  ::
                  unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                            ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                              *)in_stack_ffffffffffffe6e0,(size_t)in_stack_ffffffffffffe6d8,
                             (try_emplace_args_t *)in_stack_ffffffffffffe6d0,
                             in_stack_ffffffffffffe6c8);
                  local_5f0 = boost::unordered::detail::foa::
                              table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                              ::make_iterator((locator *)0xc19df7);
                  local_609[0] = true;
                  std::
                  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                  ::
                  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                            (&local_cc8,&local_5f0,local_609);
                }
                ppVar13 = boost::unordered::detail::foa::
                          table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                        *)0xc19e3d);
                local_10f8 = &ppVar13->second;
                __gnu_cxx::
                __normal_iterator<slang::syntax::ConfigInstanceIdentifierSyntax_**,_std::span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>_>
                ::operator++(&local_1108);
              }
              if ((local_10e9 & 1) == 0) {
                not_null<slang::syntax::ConfigRuleClauseSyntax_*>::operator*
                          ((not_null<slang::syntax::ConfigRuleClauseSyntax_*> *)0xc19e8b);
                resolve::anon_class_8_1_df254053::operator()
                          ((anon_class_8_1_df254053 *)in_stack_ffffffffffffe6e0,
                           (ConfigRuleClauseSyntax *)in_stack_ffffffffffffe6d8);
                if (local_10f8->rule == (ConfigRule *)0x0) {
                  pCVar14 = BumpAllocator::emplace<slang::ast::ConfigRule,slang::ast::ConfigRule&>
                                      ((BumpAllocator *)SVar23.endLoc,(ConfigRule *)SVar23.startLoc)
                  ;
                  local_10f8->rule = pCVar14;
                }
                else {
                  local_11a0 = &local_10d0;
                  local_1198 = local_10c0;
                  const::$_0::operator()
                            (in_stack_ffffffffffffe700,
                             (ConfigRule *)
                             CONCAT17(in_stack_ffffffffffffe6ff,in_stack_ffffffffffffe6f8),
                             in_stack_ffffffffffffe6f0,
                             (anon_class_16_2_67ede981 *)
                             CONCAT17(in_stack_ffffffffffffe6ef,in_stack_ffffffffffffe6e8));
                }
              }
            }
            else {
              local_10d4 = 0x1b0006;
              SVar27 = parsing::Token::range(in_stack_ffffffffffffe680);
              SVar25.endLoc = in_stack_ffffffffffffe7a8;
              SVar25.startLoc = in_stack_ffffffffffffe7a0;
              local_10e8 = SVar27;
              Scope::addDiag((Scope *)CONCAT17(in_stack_ffffffffffffe79f,in_stack_ffffffffffffe798),
                             SUB84((ulong)in_stack_ffffffffffffe7b0 >> 0x20,0),SVar25);
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<slang::syntax::ConfigRuleSyntax_**,_std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>_>
        ::operator++(&local_f58);
      } while( true );
    }
    ppCVar7 = __gnu_cxx::
              __normal_iterator<slang::syntax::ConfigCellIdentifierSyntax_**,_std::span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_e50);
    local_e60 = *ppCVar7;
    sVar26 = parsing::Token::valueText
                       ((Token *)CONCAT17(in_stack_ffffffffffffe677,in_stack_ffffffffffffe670));
    local_e70 = sVar26;
    bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_e70);
    if (!bVar5) {
      local_e98 = local_e70;
      sVar26 = parsing::Token::valueText
                         ((Token *)CONCAT17(in_stack_ffffffffffffe677,in_stack_ffffffffffffe670));
      local_ea8 = sVar26;
      SVar23 = slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffe6b0);
      cellName_00._M_str = in_stack_ffffffffffffe7e0;
      cellName_00._M_len = in_stack_ffffffffffffe7d8;
      libName_00._M_str = in_stack_ffffffffffffe7d0;
      libName_00._M_len = in_stack_ffffffffffffe7c8;
      sourceRange_00.startLoc._7_1_ = in_stack_ffffffffffffe977;
      sourceRange_00.startLoc._0_7_ = in_stack_ffffffffffffe970;
      sourceRange_00.endLoc = in_stack_ffffffffffffe978;
      local_eb8 = SVar23;
      local_e88 = Compilation::getDefinition
                            (in_stack_ffffffffffffe7c0,
                             (ConfigBlockSymbol *)
                             CONCAT44(in_stack_ffffffffffffe7bc,in_stack_ffffffffffffe7b8),
                             cellName_00,libName_00,sourceRange_00);
      if (local_e88 != (DefinitionSymbol *)0x0) {
        local_ed8 = SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>::size(local_e40);
        local_d48 = &local_e70;
        local_d50 = (SourceLocation)&local_ed8;
        local_d40 = local_db0;
        local_bb8 = local_d50;
        local_bb0 = local_d48;
        local_ba8 = local_db0;
        pSVar8 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                 ::al((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                       *)0xc17732);
        boost::unordered::detail::foa::
        alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
        ::alloc_cted_or_fwded_key_type(&local_bc0,pSVar8,local_bb0);
        local_af0 = boost::unordered::detail::foa::
                    alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
                    ::move_or_fwd(&local_bc0);
        local_ae8 = &local_bc1;
        local_af8 = local_bb8;
        local_ae0 = local_db0;
        local_b00 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,48ul,16ul>>
                    ::key_from<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>
                              (local_af0,local_bb8);
        local_b08 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,48ul,16ul>>
                    ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                              ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                                *)SVar23.endLoc,
                               (basic_string_view<char,_std::char_traits<char>_> *)SVar23.startLoc);
        local_b10 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                    ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                                    *)SVar23.endLoc,(size_t)SVar23.startLoc);
        local_a88 = local_b00;
        local_a98 = local_b08;
        local_a90 = local_b10;
        local_a80 = local_db0;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_aa8,local_b10);
        do {
          local_ab0 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_aa8);
          local_ab8 = boost::unordered::detail::foa::
                      table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                      ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                                *)0xc178b0);
          local_ab8 = local_ab8 + local_ab0;
          local_abc = boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::match
                                ((group15<boost::unordered::detail::foa::plain_integral> *)
                                 in_stack_ffffffffffffe668,(size_t)SVar23.endLoc);
          if (local_abc != 0) {
            local_ac8 = boost::unordered::detail::foa::
                        table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                        ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                                    *)0xc17912);
            local_ad0 = local_ac8 + local_ab0 * 0xf;
            do {
              local_ad4 = boost::unordered::detail::foa::unchecked_countr_zero(0);
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
              ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                      *)0xc17965);
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,48ul,16ul>>
              ::
              key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>>
                        ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
                          *)0xc17999);
              bVar5 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                      operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *
                                 )in_stack_ffffffffffffe680,
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 in_stack_ffffffffffffe678,
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 CONCAT17(in_stack_ffffffffffffe677,in_stack_ffffffffffffe670));
              if (bVar5) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>
                ::table_locator(&local_b28,local_ab8,local_ad4,local_ad0 + local_ad4);
                goto LAB_00c17ab5;
              }
              local_abc = local_abc - 1 & local_abc;
            } while (local_abc != 0);
          }
          bVar5 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                            ((group15<boost::unordered::detail::foa::plain_integral> *)SVar23.endLoc
                             ,(size_t)SVar23.startLoc);
          if (bVar5) {
            memset(&local_b28,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>
            ::table_locator(&local_b28);
            goto LAB_00c17ab5;
          }
          bVar5 = boost::unordered::detail::foa::pow2_quadratic_prober::next(&local_aa8,local_da0);
        } while (bVar5);
        memset(&local_b28,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>
        ::table_locator(&local_b28);
LAB_00c17ab5:
        bVar5 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                          ((table_locator *)&local_b28);
        SVar29 = SVar23.endLoc;
        if (bVar5) {
          local_b38 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                      ::make_iterator((locator *)0xc17ad7);
          local_b39 = false;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    (&local_ed0,&local_b38,&local_b39);
        }
        else if (local_d80 < local_d88) {
          SVar28 = local_af8;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,48ul,16ul>>
          ::
          unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long>
                    (in_stack_ffffffffffffe690,
                     CONCAT17(in_stack_ffffffffffffe68f,in_stack_ffffffffffffe688),
                     (size_t)in_stack_ffffffffffffe680,
                     (try_emplace_args_t *)in_stack_ffffffffffffe678,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT17(in_stack_ffffffffffffe677,in_stack_ffffffffffffe670),
                     (unsigned_long *)in_stack_ffffffffffffe6a0);
          local_b50 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                      ::make_iterator((locator *)0xc17b79);
          local_b69[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    (&local_ed0,&local_b50,local_b69);
          SVar23.endLoc = SVar29;
          SVar23.startLoc = SVar28;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,48ul,16ul>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long>
                    ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                      *)in_stack_ffffffffffffe6f0,
                     CONCAT17(in_stack_ffffffffffffe6ef,in_stack_ffffffffffffe6e8),
                     (try_emplace_args_t *)in_stack_ffffffffffffe6e0,
                     (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe6d8,
                     (unsigned_long *)in_stack_ffffffffffffe6d0);
          local_b80 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
                      ::make_iterator((locator *)0xc17bf4);
          local_b99[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    (&local_ed0,&local_b80,local_b99);
        }
        local_ee0 = std::
                    get<0ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                              ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                                *)0xc17c3c);
        local_ee8 = std::
                    get<1ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                              ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                                *)0xc17c51);
        if ((*local_ee8 & 1U) == 0) {
          local_efc = 0x190006;
          SVar27 = parsing::Token::range(in_stack_ffffffffffffe680);
          sourceRange.endLoc = in_stack_ffffffffffffe7a8;
          sourceRange.startLoc = in_stack_ffffffffffffe7a0;
          local_f10 = SVar27;
          Scope::addDiag((Scope *)CONCAT17(in_stack_ffffffffffffe79f,in_stack_ffffffffffffe798),
                         SUB84((ulong)in_stack_ffffffffffffe7b0 >> 0x20,0),sourceRange);
          arg._M_len._4_4_ = in_stack_ffffffffffffe6ac;
          arg._M_len._0_4_ = in_stack_ffffffffffffe6a8;
          arg._M_str = (char *)in_stack_ffffffffffffe6b0;
          local_f28 = local_e70;
          Diagnostic::operator<<(in_stack_ffffffffffffe6a0,arg);
        }
        else {
          SVar27 = slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffe6b0);
          local_ef8 = SVar27;
          SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>::
          emplace_back<slang::ast::DefinitionSymbol_const&,slang::SourceRange>
                    ((SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell> *)
                     in_stack_ffffffffffffe678,
                     (DefinitionSymbol *)
                     CONCAT17(in_stack_ffffffffffffe677,in_stack_ffffffffffffe670),
                     (SourceRange *)in_stack_ffffffffffffe668);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<slang::syntax::ConfigCellIdentifierSyntax_**,_std::span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_e50);
  } while( true );
}

Assistant:

void ConfigBlockSymbol::resolve() const {
    SLANG_ASSERT(!resolved);
    resolved = true;

    auto scope = getParentScope();
    SLANG_ASSERT(getSyntax() && scope);

    auto& comp = scope->getCompilation();
    auto& syntax = getSyntax()->as<ConfigDeclarationSyntax>();

    SmallMap<std::string_view, size_t, 2> topCellNames;
    SmallVector<TopCell> topCellsBuf;
    for (auto cellId : syntax.topCells) {
        auto cellName = cellId->cell.valueText();
        if (!cellName.empty()) {
            auto def = comp.getDefinition(*this, cellName, cellId->library.valueText(),
                                          cellId->sourceRange());
            if (!def)
                continue;

            auto [it, inserted] = topCellNames.emplace(cellName, topCellsBuf.size());
            if (inserted)
                topCellsBuf.emplace_back(*def, cellId->sourceRange());
            else
                scope->addDiag(diag::ConfigDupTop, cellId->cell.range()) << cellName;
        }
    }

    auto buildLiblist = [&](const ConfigLiblistSyntax& cll) {
        SmallVector<const SourceLibrary*> buf;
        for (auto token : cll.libraries) {
            if (auto name = token.valueText(); !name.empty()) {
                if (auto lib = comp.getSourceLibrary(name))
                    buf.push_back(lib);
                else
                    scope->addDiag(diag::WarnUnknownLibrary, token.range()) << name;
            }
        }
        return buf.copy(comp);
    };

    auto buildRule = [&](const ConfigRuleClauseSyntax& rule) {
        ConfigRule result(*rule.parent);
        if (rule.kind == SyntaxKind::ConfigUseClause) {
            auto& cuc = rule.as<ConfigUseClauseSyntax>();
            result.paramOverrides = cuc.paramAssignments;
            if (cuc.name && !cuc.name->cell.valueText().empty()) {
                result.useCell.lib = cuc.name->library.valueText();
                result.useCell.name = cuc.name->cell.valueText();
                result.useCell.sourceRange = cuc.name->sourceRange();
                if (cuc.config)
                    result.useCell.targetConfig = true;
            }
        }
        else {
            result.liblist = buildLiblist(rule.as<ConfigLiblistSyntax>());
        }
        return result;
    };

    auto mergeRules = [&](ConfigRule& curRule, const ConfigRule& newRule, auto&& nameGetter) {
        if ((bool(newRule.paramOverrides) && bool(curRule.paramOverrides)) ||
            (newRule.liblist.has_value() && curRule.liblist.has_value()) ||
            (!newRule.useCell.name.empty() && !curRule.useCell.name.empty())) {

            auto& diag = scope->addDiag(diag::DupConfigRule, newRule.syntax->sourceRange())
                         << nameGetter();
            diag.addNote(diag::NotePreviousDefinition, curRule.syntax->sourceRange());
        }
        else {
            if (newRule.paramOverrides)
                curRule.paramOverrides = newRule.paramOverrides;
            if (newRule.liblist)
                curRule.liblist = newRule.liblist;
            if (!newRule.useCell.name.empty()) {
                // Note: prefer the source range to come from the rule that
                // supplies a use cell name, to make other reported errors easier
                // to understand.
                curRule.useCell = newRule.useCell;
                curRule.syntax = newRule.syntax;
            }
        }
    };

    for (auto ruleSyntax : syntax.rules) {
        switch (ruleSyntax->kind) {
            case SyntaxKind::DefaultConfigRule:
                defaultLiblist = buildLiblist(*ruleSyntax->as<DefaultConfigRuleSyntax>().liblist);
                break;
            case SyntaxKind::CellConfigRule: {
                auto& ccr = ruleSyntax->as<CellConfigRuleSyntax>();
                auto cellName = ccr.name->cell.valueText();
                if (cellName.empty())
                    break;

                auto rule = comp.emplace<ConfigRule>(buildRule(*ccr.ruleClause));

                auto& overrides = cellOverrides[cellName];
                if (auto libName = ccr.name->library.valueText(); !libName.empty()) {
                    auto specificLib = comp.getSourceLibrary(libName);
                    if (!specificLib) {
                        scope->addDiag(diag::WarnUnknownLibrary, ccr.name->library.range())
                            << libName;
                        break;
                    }

                    auto [it, inserted] = overrides.specificLibRules.emplace(specificLib, rule);
                    if (!inserted) {
                        mergeRules(*it->second, *rule, [&] {
                            return fmt::format("cell '{}.{}'", specificLib->name, cellName);
                        });
                    }
                }
                else if (overrides.defaultRule) {
                    mergeRules(*overrides.defaultRule, *rule,
                               [&] { return fmt::format("cell '{}'", cellName); });
                }
                else {
                    overrides.defaultRule = rule;
                }
                break;
            }
            case SyntaxKind::InstanceConfigRule: {
                auto& icr = ruleSyntax->as<InstanceConfigRuleSyntax>();
                const auto topName = icr.topModule.valueText();
                if (topName.empty())
                    break;

                if (!topCellNames.contains(topName)) {
                    scope->addDiag(diag::ConfigInstanceWrongTop, icr.topModule.range());
                    break;
                }

                bool bad = false;
                auto node = &instanceOverrides[topName];
                for (auto& part : icr.instanceNames) {
                    auto partName = part->name.valueText();
                    bad |= partName.empty();
                    node = &node->childNodes[partName];
                }

                if (bad)
                    break;

                auto rule = buildRule(*icr.ruleClause);
                if (!node->rule) {
                    // No rule here yet; copy into our allocator and save it.
                    node->rule = comp.emplace<ConfigRule>(rule);
                }
                else {
                    // Merge the two rules, or warn if we cannot.
                    mergeRules(*node->rule, rule, [&] {
                        std::string name = "instance '";
                        name += topName;
                        for (auto& part : icr.instanceNames) {
                            name.push_back('.');
                            name += part->name.valueText();
                        }
                        name.push_back('\'');
                        return name;
                    });
                }
                break;
            }
            default:
                SLANG_UNREACHABLE;
        }
    }

    auto checkTopOverride = [&](const ConfigRule& rule) {
        if (!rule.useCell.name.empty())
            scope->addDiag(diag::ConfigOverrideTop, rule.syntax->sourceRange());
    };

    // Check if any overrides should apply to the root instances.
    for (auto& [cellName, instOverride] : instanceOverrides) {
        if (instOverride.rule) {
            auto it = topCellNames.find(cellName);
            SLANG_ASSERT(it != topCellNames.end());
            checkTopOverride(*instOverride.rule);
            topCellsBuf[it->second].rule = instOverride.rule;
        }
    }

    for (auto& topCell : topCellsBuf) {
        // If we already set a rule for this cell via an instance
        // override we don't need a less specific cell override.
        if (topCell.rule)
            continue;

        if (auto it = cellOverrides.find(topCell.definition.name); it != cellOverrides.end()) {
            topCell.rule = it->second.defaultRule;
            auto& specificLibRules = it->second.specificLibRules;
            if (auto specificIt = specificLibRules.find(&topCell.definition.sourceLibrary);
                specificIt != specificLibRules.end()) {
                topCell.rule = specificIt->second;
            }

            if (topCell.rule)
                checkTopOverride(*topCell.rule);
        }
    }

    topCells = topCellsBuf.copy(comp);

    // Now that all rules have been resolved, go back through and
    // register them for later lookup by syntax.
    for (auto& [_, cellOverride] : cellOverrides) {
        if (cellOverride.defaultRule)
            ruleBySyntax[cellOverride.defaultRule->syntax] = cellOverride.defaultRule;

        for (auto& [lib, rule] : cellOverride.specificLibRules)
            ruleBySyntax[rule->syntax] = rule;
    }

    for (auto& [_, instOverride] : getInstanceOverrides())
        registerRules(instOverride);
}